

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void purge_logically_deleted_doc_test(void)

{
  fdb_encryption_key new_key;
  void *ptr;
  fdb_doc *doc;
  long lVar1;
  fdb_kvs_handle **ppfVar2;
  fdb_status fVar3;
  int iVar4;
  btree *config;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  fdb_kvs_handle **ppfVar8;
  ulong uVar9;
  fdb_kvs_handle *handle;
  long lVar10;
  fdb_config *pfVar11;
  fdb_doc **ppfVar12;
  fdb_doc *pfVar13;
  char *ptr_handle;
  uint uVar14;
  fdb_kvs_handle *unaff_RBP;
  fdb_kvs_handle *pfVar15;
  fdb_encryption_key *pfVar16;
  fdb_doc *pfVar17;
  fdb_kvs_handle **unaff_R12;
  fdb_kvs_handle *unaff_R13;
  fdb_file_handle **ptr_fhandle;
  fdb_doc **doc_00;
  fdb_kvs_handle *pfVar18;
  char *pcVar19;
  fdb_kvs_handle **ppfVar20;
  char *pcVar21;
  bool bVar22;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_1ce90;
  fdb_file_handle *pfStack_1ce88;
  void *pvStack_1ce80;
  size_t asStack_1ce78 [3];
  undefined4 uStack_1ce60;
  undefined4 uStack_1ce5c;
  undefined4 uStack_1ce58;
  undefined4 uStack_1ce54;
  undefined4 uStack_1ce50;
  fdb_kvs_config fStack_1ce48;
  timeval tStack_1ce30;
  fdb_config fStack_1ce20;
  char acStack_1cd28 [256];
  char acStack_1cc28 [256];
  char acStack_1cb28 [264];
  fdb_config *pfStack_1ca20;
  fdb_kvs_handle **ppfStack_1ca18;
  fdb_kvs_handle *pfStack_1ca10;
  fdb_kvs_handle **ppfStack_1ca08;
  fdb_kvs_handle *pfStack_1ca00;
  code *pcStack_1c9f8;
  fdb_kvs_handle *pfStack_1c9e0;
  fdb_file_handle *pfStack_1c9d8;
  fdb_kvs_handle *pfStack_1c9d0;
  fdb_kvs_handle *pfStack_1c9c8;
  fdb_kvs_config fStack_1c9c0;
  timeval tStack_1c9a8;
  fdb_config fStack_1c998;
  fdb_kvs_handle *apfStack_1c8a0 [32];
  fdb_config fStack_1c7a0;
  fdb_kvs_handle **ppfStack_1c698;
  fdb_kvs_handle **ppfStack_1c690;
  fdb_kvs_handle **ppfStack_1c688;
  fdb_kvs_handle *pfStack_1c680;
  fdb_kvs_handle *pfStack_1c670;
  fdb_kvs_handle *pfStack_1c668;
  fdb_kvs_handle **ppfStack_1c660;
  fdb_kvs_handle *pfStack_1c658;
  fdb_kvs_config fStack_1c650;
  undefined1 auStack_1c638 [128];
  fdb_kvs_handle *apfStack_1c5b8 [33];
  fdb_config fStack_1c4b0;
  fdb_kvs_handle *apfStack_1c3b8 [32];
  fdb_kvs_handle *apfStack_1c2b8 [32];
  fdb_kvs_handle fStack_1c1b8;
  undefined8 auStack_1bdb8 [896];
  fdb_kvs_handle *apfStack_1a1b8 [1025];
  fdb_doc **ppfStack_181b0;
  char *pcStack_181a8;
  long lStack_181a0;
  fdb_doc *pfStack_18198;
  fdb_doc **ppfStack_18190;
  fdb_doc *pfStack_18188;
  fdb_doc *pfStack_18170;
  fdb_file_handle *pfStack_18168;
  long lStack_18160;
  fdb_kvs_handle *pfStack_18158;
  long lStack_18150;
  long lStack_18148;
  fdb_doc **ppfStack_18140;
  long lStack_18138;
  fdb_doc **ppfStack_18130;
  size_t sStack_18128;
  timeval tStack_18120;
  fdb_kvs_config fStack_18110;
  fdb_file_info fStack_180f8;
  fdb_doc afStack_180b0 [3];
  char acStack_17fb0 [264];
  fdb_config fStack_17ea8;
  char acStack_17db0 [256];
  fdb_doc *apfStack_17cb0 [2999];
  size_t sStack_11ef8;
  size_t asStack_11ef0 [1023];
  undefined1 auStack_fef1 [57225];
  fdb_doc **ppfStack_1f68;
  fdb_config *pfStack_1f60;
  fdb_file_handle **ppfStack_1f58;
  ulong uStack_1f50;
  fdb_kvs_handle **ppfStack_1f48;
  fdb_kvs_handle **ppfStack_1f40;
  fdb_doc *pfStack_1f28;
  fdb_kvs_handle *pfStack_1f20;
  undefined1 auStack_1f18 [24];
  fdb_file_handle *pfStack_1f00;
  fdb_kvs_handle *pfStack_1ef8;
  fdb_kvs_config fStack_1ef0;
  fdb_doc *apfStack_1ed8 [31];
  timeval tStack_1de0;
  fdb_config fStack_1dd0;
  char acStack_1cd8 [256];
  fdb_file_handle *apfStack_1bd8 [32];
  char acStack_1ad8 [264];
  fdb_kvs_handle **ppfStack_19d0;
  char *pcStack_19c8;
  char *pcStack_19c0;
  ulong uStack_19b8;
  undefined8 uStack_19b0;
  code *pcStack_19a8;
  fdb_file_handle *pfStack_19a0;
  fdb_kvs_handle *pfStack_1998;
  char acStack_1990 [32];
  fdb_kvs_config fStack_1970;
  timeval tStack_1958;
  fdb_file_info afStack_1948 [3];
  fdb_config fStack_1850;
  fdb_config *pfStack_1758;
  fdb_kvs_handle **ppfStack_1750;
  fdb_kvs_handle *pfStack_1748;
  fdb_doc *pfStack_1740;
  fdb_kvs_handle *pfStack_1738;
  fdb_encryption_key *pfStack_1730;
  fdb_kvs_handle *pfStack_1720;
  fdb_file_handle *pfStack_1718;
  undefined1 auStack_1710 [8];
  undefined1 auStack_1708 [48];
  fdb_kvs_handle *apfStack_16d8 [32];
  fdb_doc afStack_15d8 [3];
  fdb_config fStack_14d8;
  ulong uStack_13e0;
  fdb_kvs_handle **ppfStack_13d8;
  fdb_kvs_handle *pfStack_13d0;
  fdb_doc *pfStack_13c8;
  fdb_kvs_handle *pfStack_13c0;
  fdb_encryption_key *pfStack_13b8;
  fdb_doc *pfStack_13a8;
  fdb_kvs_handle *pfStack_13a0;
  fdb_kvs_handle *pfStack_1398;
  fdb_file_handle *pfStack_1390;
  fdb_file_handle *pfStack_1388;
  fdb_doc *apfStack_1380 [11];
  fdb_kvs_config fStack_1328;
  timeval tStack_1310;
  fdb_kvs_handle fStack_1300;
  fdb_config fStack_1000;
  fdb_kvs_config *pfStack_f08;
  fdb_file_handle **ppfStack_f00;
  fdb_file_handle **ppfStack_ef8;
  fdb_kvs_handle **ppfStack_ef0;
  char *pcStack_ee8;
  fdb_kvs_handle *pfStack_ee0;
  fdb_file_handle *pfStack_ec8;
  fdb_file_handle *pfStack_ec0;
  fdb_kvs_handle *pfStack_eb8;
  fdb_kvs_handle *pfStack_eb0;
  timeval tStack_ea8;
  fdb_doc *apfStack_e98 [31];
  fdb_kvs_config fStack_da0;
  char acStack_d88 [264];
  fdb_config fStack_c80;
  char acStack_b88 [256];
  char acStack_a88 [264];
  fdb_kvs_handle *pfStack_980;
  fdb_kvs_handle **ppfStack_978;
  fdb_kvs_handle *pfStack_970;
  fdb_kvs_handle *pfStack_968;
  fdb_kvs_handle **ppfStack_960;
  fdb_kvs_handle *pfStack_958;
  fdb_kvs_handle *pfStack_948;
  fdb_kvs_handle *pfStack_940;
  fdb_kvs_handle *pfStack_938;
  fdb_kvs_handle *pfStack_930;
  timeval tStack_928;
  undefined1 auStack_918 [280];
  fdb_kvs_handle fStack_800;
  fdb_kvs_handle **ppfStack_4f8;
  fdb_kvs_handle **ppfStack_4f0;
  fdb_kvs_handle *pfStack_4e8;
  btree *pbStack_4e0;
  fdb_kvs_handle *pfStack_4d8;
  fdb_kvs_handle *pfStack_4d0;
  fdb_kvs_handle *local_4c0;
  fdb_kvs_handle *local_4b8;
  fdb_file_handle *local_4b0;
  undefined1 auStack_4a8 [104];
  btree local_440 [5];
  undefined1 local_328 [520];
  undefined8 local_120;
  undefined8 local_118;
  undefined4 local_10c;
  undefined4 local_104;
  undefined1 local_f9;
  
  pfStack_4d0 = (fdb_kvs_handle *)0x116ac9;
  gettimeofday((timeval *)(auStack_4a8 + 0x58),(__timezone_ptr_t)0x0);
  pfStack_4d0 = (fdb_kvs_handle *)0x116ace;
  memleak_start();
  local_4c0 = (fdb_kvs_handle *)0x0;
  pfStack_4d0 = (fdb_kvs_handle *)0x116adf;
  system("rm -rf  dummy* fdb_test_config.json > errorlog.txt");
  pfStack_4d0 = (fdb_kvs_handle *)0x116aef;
  fdb_get_default_config();
  config = local_440;
  pfStack_4d0 = (fdb_kvs_handle *)0x116aff;
  fdb_get_default_kvs_config();
  local_120 = 0;
  local_118 = 0x400;
  local_104 = 1;
  local_10c = 2;
  local_f9 = 0;
  pfVar18 = (fdb_kvs_handle *)&local_4b0;
  pfStack_4d0 = (fdb_kvs_handle *)0x116b34;
  fdb_open((fdb_file_handle **)pfVar18,"./dummy1",(fdb_config *)(local_328 + 0x200));
  ppfVar8 = &local_4b8;
  pfStack_4d0 = (fdb_kvs_handle *)0x116b47;
  fdb_kvs_open_default(local_4b0,ppfVar8,(fdb_kvs_config *)config);
  pfStack_4d0 = (fdb_kvs_handle *)0x116b5d;
  fVar3 = fdb_set_log_callback(local_4b8,logCallbackFunc,"purge_logically_deleted_doc_test");
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116fcb;
  unaff_R12 = (fdb_kvs_handle **)0x0;
  uVar9 = 0;
  do {
    pfStack_4d0 = (fdb_kvs_handle *)0x116b85;
    sprintf(local_328 + 0x100,"key%d",uVar9 & 0xffffffff);
    pfStack_4d0 = (fdb_kvs_handle *)0x116b9d;
    sprintf(local_328,"meta%d",uVar9 & 0xffffffff);
    pfStack_4d0 = (fdb_kvs_handle *)0x116bb5;
    sprintf((char *)&local_440[0].blk_ops,"body%d",uVar9 & 0xffffffff);
    pfVar18 = (fdb_kvs_handle *)(auStack_4a8 + (long)unaff_R12);
    pfStack_4d0 = (fdb_kvs_handle *)0x116bc5;
    unaff_R13 = (fdb_kvs_handle *)strlen(local_328 + 0x100);
    unaff_RBP = (fdb_kvs_handle *)local_328;
    pfStack_4d0 = (fdb_kvs_handle *)0x116bd8;
    config = (btree *)strlen((char *)unaff_RBP);
    pfStack_4d0 = (fdb_kvs_handle *)0x116be8;
    sVar5 = strlen((char *)&local_440[0].blk_ops);
    pfStack_4d0 = (fdb_kvs_handle *)0x116c0d;
    fdb_doc_create((fdb_doc **)pfVar18,local_328 + 0x100,(size_t)unaff_R13,unaff_RBP,(size_t)config,
                   &local_440[0].blk_ops,sVar5);
    pfStack_4d0 = (fdb_kvs_handle *)0x116c1c;
    fdb_set(local_4b8,*(fdb_doc **)(auStack_4a8 + uVar9 * 8));
    uVar9 = uVar9 + 1;
    unaff_R12 = unaff_R12 + 1;
  } while (uVar9 != 10);
  ppfVar8 = &local_4c0;
  pfStack_4d0 = (fdb_kvs_handle *)0x116c59;
  fdb_doc_create((fdb_doc **)ppfVar8,*(void **)(auStack_4a8._40_8_ + 0x20),
                 *(size_t *)auStack_4a8._40_8_,*(btree_kv_ops **)(auStack_4a8._40_8_ + 0x38),
                 *(bid_t *)(auStack_4a8._40_8_ + 8),(void *)0x0,0);
  pfStack_4d0 = (fdb_kvs_handle *)0x116c66;
  fVar3 = fdb_del(local_4b8,(fdb_doc *)local_4c0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfVar8 = &local_4c0;
    pfStack_4d0 = (fdb_kvs_handle *)0x116c7b;
    fdb_doc_free((fdb_doc *)local_4c0);
    local_4c0 = (fdb_kvs_handle *)0x0;
    pfStack_4d0 = (fdb_kvs_handle *)0x116c91;
    fdb_commit(local_4b0,'\0');
    pfStack_4d0 = (fdb_kvs_handle *)0x116ca2;
    fdb_compact(local_4b0,"./dummy2");
    unaff_R13 = (fdb_kvs_handle *)0x0;
    pfVar15 = unaff_RBP;
    do {
      pfStack_4d0 = (fdb_kvs_handle *)0x116cc9;
      fdb_doc_create((fdb_doc **)ppfVar8,
                     (void *)(*(size_t **)(auStack_4a8 + (long)unaff_R13 * 8))[4],
                     **(size_t **)(auStack_4a8 + (long)unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0);
      pfStack_4d0 = (fdb_kvs_handle *)0x116cd8;
      fVar3 = fdb_get(local_4b8,(fdb_doc *)local_4c0);
      unaff_RBP = local_4c0;
      if (unaff_R13 != (fdb_kvs_handle *)0x5) {
        if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00116f87:
          pfStack_4d0 = (fdb_kvs_handle *)0x116f8c;
          purge_logically_deleted_doc_test();
          unaff_RBP = pfVar15;
          goto LAB_00116f8c;
        }
        config = local_4c0->staletree;
        ppfVar20 = *(fdb_kvs_handle ***)(auStack_4a8 + (long)unaff_R13 * 8);
        pfVar18 = ppfVar20[7];
        pfStack_4d0 = (fdb_kvs_handle *)0x116d14;
        iVar4 = bcmp(config,pfVar18,(size_t)(local_4c0->kvs_config).custom_cmp);
        unaff_R12 = ppfVar8;
        if (iVar4 == 0) {
          config = (unaff_RBP->field_6).seqtree;
          pfVar18 = ppfVar20[8];
          pfStack_4d0 = (fdb_kvs_handle *)0x116d33;
          iVar4 = bcmp(config,pfVar18,(size_t)(unaff_RBP->kvs_config).custom_cmp_param);
          if (iVar4 == 0) goto LAB_00116d44;
LAB_00116f7c:
          pfStack_4d0 = (fdb_kvs_handle *)0x116f87;
          purge_logically_deleted_doc_test();
          pfVar15 = unaff_RBP;
          goto LAB_00116f87;
        }
LAB_00116f91:
        pfStack_4d0 = (fdb_kvs_handle *)0x116f9c;
        purge_logically_deleted_doc_test();
        goto LAB_00116f9c;
      }
      unaff_RBP = pfVar15;
      if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) {
LAB_00116f8c:
        pfStack_4d0 = (fdb_kvs_handle *)0x116f91;
        purge_logically_deleted_doc_test();
        ppfVar20 = ppfVar8;
        unaff_R12 = (fdb_kvs_handle **)0x0;
        goto LAB_00116f91;
      }
LAB_00116d44:
      unaff_R12 = (fdb_kvs_handle **)0x0;
      pfStack_4d0 = (fdb_kvs_handle *)0x116d4e;
      fdb_doc_free((fdb_doc *)local_4c0);
      local_4c0 = (fdb_kvs_handle *)0x0;
      pfStack_4d0 = (fdb_kvs_handle *)0x116d73;
      fdb_doc_create((fdb_doc **)ppfVar8,
                     (void *)(*(size_t **)(auStack_4a8 + (long)unaff_R13 * 8))[4],
                     **(size_t **)(auStack_4a8 + (long)unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0);
      pfStack_4d0 = (fdb_kvs_handle *)0x116d82;
      fVar3 = fdb_get_metaonly(local_4b8,(fdb_doc *)local_4c0);
      if (unaff_R13 == (fdb_kvs_handle *)0x5) {
        if ((fVar3 != FDB_RESULT_KEY_NOT_FOUND) && (fVar3 != FDB_RESULT_SUCCESS)) goto LAB_00116fc6;
      }
      else if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_4d0 = (fdb_kvs_handle *)0x116f7c;
        purge_logically_deleted_doc_test();
        goto LAB_00116f7c;
      }
      pfStack_4d0 = (fdb_kvs_handle *)0x116da8;
      fdb_doc_free((fdb_doc *)local_4c0);
      local_4c0 = (fdb_kvs_handle *)0x0;
      unaff_R13 = (fdb_kvs_handle *)&(unaff_R13->kvs_config).field_0x1;
      pfVar15 = unaff_RBP;
    } while (unaff_R13 != (fdb_kvs_handle *)0xa);
    pfStack_4d0 = (fdb_kvs_handle *)0x116dca;
    puts("wait for 3 seconds..");
    pfStack_4d0 = (fdb_kvs_handle *)0x116dd4;
    sleep(3);
    pfStack_4d0 = (fdb_kvs_handle *)0x116de5;
    fdb_compact(local_4b0,"./dummy3");
    ppfVar20 = &local_4c0;
    unaff_R13 = (fdb_kvs_handle *)0x0;
    do {
      unaff_R12 = (fdb_kvs_handle **)0x0;
      pfStack_4d0 = (fdb_kvs_handle *)0x116e14;
      fdb_doc_create((fdb_doc **)ppfVar20,
                     (void *)(*(size_t **)(auStack_4a8 + (long)unaff_R13 * 8))[4],
                     **(size_t **)(auStack_4a8 + (long)unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0);
      pfStack_4d0 = (fdb_kvs_handle *)0x116e23;
      fVar3 = fdb_get(local_4b8,(fdb_doc *)local_4c0);
      pfVar15 = local_4c0;
      if (unaff_R13 == (fdb_kvs_handle *)0x5) {
        pfVar15 = unaff_RBP;
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00116fa1;
      }
      else {
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116f9c;
        config = local_4c0->staletree;
        unaff_R12 = *(fdb_kvs_handle ***)(auStack_4a8 + (long)unaff_R13 * 8);
        pfVar18 = unaff_R12[7];
        pfStack_4d0 = (fdb_kvs_handle *)0x116e5d;
        iVar4 = bcmp(config,pfVar18,(size_t)(local_4c0->kvs_config).custom_cmp);
        if (iVar4 != 0) goto LAB_00116fab;
        config = (pfVar15->field_6).seqtree;
        pfVar18 = unaff_R12[8];
        pfStack_4d0 = (fdb_kvs_handle *)0x116e7d;
        iVar4 = bcmp(config,pfVar18,(size_t)(pfVar15->kvs_config).custom_cmp_param);
        unaff_R12 = (fdb_kvs_handle **)0x0;
        if (iVar4 != 0) goto LAB_00116fbb;
      }
      unaff_R12 = (fdb_kvs_handle **)0x0;
      pfStack_4d0 = (fdb_kvs_handle *)0x116e95;
      fdb_doc_free((fdb_doc *)local_4c0);
      local_4c0 = (fdb_kvs_handle *)0x0;
      pfStack_4d0 = (fdb_kvs_handle *)0x116eba;
      fdb_doc_create((fdb_doc **)ppfVar20,
                     (void *)(*(size_t **)(auStack_4a8 + (long)unaff_R13 * 8))[4],
                     **(size_t **)(auStack_4a8 + (long)unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0);
      pfStack_4d0 = (fdb_kvs_handle *)0x116ec9;
      fVar3 = fdb_get_metaonly(local_4b8,(fdb_doc *)local_4c0);
      if (unaff_R13 == (fdb_kvs_handle *)0x5) {
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00116fa6;
      }
      else if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116fb6;
      pfStack_4d0 = (fdb_kvs_handle *)0x116eeb;
      fdb_doc_free((fdb_doc *)local_4c0);
      local_4c0 = (fdb_kvs_handle *)0x0;
      unaff_R13 = (fdb_kvs_handle *)&(unaff_R13->kvs_config).field_0x1;
      unaff_RBP = pfVar15;
      if (unaff_R13 == (fdb_kvs_handle *)0xa) {
        pfStack_4d0 = (fdb_kvs_handle *)0x116f0b;
        fdb_kvs_close(local_4b8);
        pfStack_4d0 = (fdb_kvs_handle *)0x116f15;
        fdb_close(local_4b0);
        lVar10 = 0;
        do {
          pfStack_4d0 = (fdb_kvs_handle *)0x116f21;
          fdb_doc_free(*(fdb_doc **)(auStack_4a8 + lVar10 * 8));
          lVar10 = lVar10 + 1;
        } while (lVar10 != 10);
        pfStack_4d0 = (fdb_kvs_handle *)0x116f2f;
        fdb_shutdown();
        pfStack_4d0 = (fdb_kvs_handle *)0x116f34;
        memleak_end();
        pcVar19 = "%s PASSED\n";
        if (purge_logically_deleted_doc_test()::__test_pass != '\0') {
          pcVar19 = "%s FAILED\n";
        }
        pfStack_4d0 = (fdb_kvs_handle *)0x116f65;
        fprintf(_stderr,pcVar19,"purge logically deleted doc test");
        return;
      }
    } while( true );
  }
  goto LAB_00116fd0;
LAB_001172d0:
  pfStack_958 = (fdb_kvs_handle *)0x1172e0;
  api_wrapper_test();
LAB_001172e0:
  pfStack_958 = (fdb_kvs_handle *)0x1172e5;
  api_wrapper_test();
LAB_001172e5:
  pfVar15 = (fdb_kvs_handle *)(auStack_918 + 0x18);
  pfStack_958 = (fdb_kvs_handle *)0x1172ea;
  api_wrapper_test();
  goto LAB_001172ea;
LAB_00117e03:
  pfStack_13b8 = (fdb_encryption_key *)0x117e13;
  flush_before_commit_multi_writers_test();
  pfVar13 = pfVar17;
  goto LAB_00117e13;
LAB_00118159:
  pfStack_1730 = (fdb_encryption_key *)0x118166;
  auto_commit_test();
  pfVar15 = (fdb_kvs_handle *)pcVar19;
LAB_00118166:
  pcVar19 = (char *)pfVar15;
  pfStack_1730 = (fdb_encryption_key *)0x11816b;
  auto_commit_test();
LAB_0011816b:
  pfStack_1730 = (fdb_encryption_key *)0x118178;
  auto_commit_test();
  pfVar15 = (fdb_kvs_handle *)pcVar19;
LAB_00118178:
  pfVar17 = afStack_15d8;
  ppfVar8 = apfStack_16d8;
  pfStack_1730 = (fdb_encryption_key *)0x11817d;
  auto_commit_test();
  goto LAB_0011817d;
LAB_0011943e:
  pfStack_1c680 = (fdb_kvs_handle *)0x119443;
  open_multi_files_kvs_test();
LAB_00119443:
  pfStack_1c680 = (fdb_kvs_handle *)0x119448;
  open_multi_files_kvs_test();
LAB_00119448:
  pfStack_1c680 = (fdb_kvs_handle *)0x11944d;
  open_multi_files_kvs_test();
LAB_0011944d:
  pfStack_1c680 = (fdb_kvs_handle *)0x119452;
  open_multi_files_kvs_test();
  pfVar18 = (fdb_kvs_handle *)pcVar21;
LAB_00119452:
  pfStack_1c680 = (fdb_kvs_handle *)0x119457;
  open_multi_files_kvs_test();
LAB_00119457:
  pfStack_1c680 = (fdb_kvs_handle *)0x11945c;
  open_multi_files_kvs_test();
LAB_0011945c:
  pfStack_1c680 = (fdb_kvs_handle *)0x119461;
  open_multi_files_kvs_test();
LAB_00119461:
  pfStack_1c680 = (fdb_kvs_handle *)0x119466;
  open_multi_files_kvs_test();
LAB_00119466:
  pfStack_1c680 = (fdb_kvs_handle *)0x11946b;
  open_multi_files_kvs_test();
  goto LAB_0011946b;
LAB_00119a0a:
  rekey_test();
  goto LAB_00119a1a;
LAB_00116f9c:
  pfStack_4d0 = (fdb_kvs_handle *)0x116fa1;
  purge_logically_deleted_doc_test();
  pfVar15 = unaff_RBP;
LAB_00116fa1:
  pfStack_4d0 = (fdb_kvs_handle *)0x116fa6;
  purge_logically_deleted_doc_test();
LAB_00116fa6:
  pfStack_4d0 = (fdb_kvs_handle *)0x116fab;
  purge_logically_deleted_doc_test();
LAB_00116fab:
  pfStack_4d0 = (fdb_kvs_handle *)0x116fb6;
  purge_logically_deleted_doc_test();
LAB_00116fb6:
  pfStack_4d0 = (fdb_kvs_handle *)0x116fbb;
  purge_logically_deleted_doc_test();
LAB_00116fbb:
  pfStack_4d0 = (fdb_kvs_handle *)0x116fc6;
  purge_logically_deleted_doc_test();
  ppfVar8 = ppfVar20;
  unaff_RBP = pfVar15;
LAB_00116fc6:
  pfStack_4d0 = (fdb_kvs_handle *)0x116fcb;
  purge_logically_deleted_doc_test();
LAB_00116fcb:
  pfStack_4d0 = (fdb_kvs_handle *)0x116fd0;
  purge_logically_deleted_doc_test();
LAB_00116fd0:
  pfStack_4d0 = (fdb_kvs_handle *)api_wrapper_test;
  purge_logically_deleted_doc_test();
  pfStack_958 = (fdb_kvs_handle *)0x116ff2;
  ppfStack_4f8 = ppfVar8;
  ppfStack_4f0 = unaff_R12;
  pfStack_4e8 = unaff_R13;
  pbStack_4e0 = config;
  pfStack_4d8 = pfVar18;
  pfStack_4d0 = unaff_RBP;
  gettimeofday(&tStack_928,(__timezone_ptr_t)0x0);
  pfStack_958 = (fdb_kvs_handle *)0x116ff7;
  memleak_start();
  pfStack_958 = (fdb_kvs_handle *)0x117003;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_958 = (fdb_kvs_handle *)0x117013;
  fdb_get_default_config();
  pfVar15 = (fdb_kvs_handle *)auStack_918;
  pfStack_958 = (fdb_kvs_handle *)0x117020;
  fdb_get_default_kvs_config();
  fStack_800.config.encryption_key.bytes[0xc] = '\0';
  fStack_800.config.encryption_key.bytes[0xd] = '\0';
  fStack_800.config.encryption_key.bytes[0xe] = '\0';
  fStack_800.config.encryption_key.bytes[0xf] = '\0';
  fStack_800.config.encryption_key.bytes[0x10] = '\0';
  fStack_800.config.encryption_key.bytes[0x11] = '\0';
  fStack_800.config.encryption_key.bytes[0x12] = '\0';
  fStack_800.config.encryption_key.bytes[0x13] = '\0';
  fStack_800.config.encryption_key.bytes[0x14] = '\0';
  fStack_800.config.encryption_key.bytes[0x15] = '\x04';
  fStack_800.config.encryption_key.bytes[0x16] = '\0';
  fStack_800.config.encryption_key.bytes[0x17] = '\0';
  fStack_800.config.encryption_key.bytes[0x18] = '\0';
  fStack_800.config.encryption_key.bytes[0x19] = '\0';
  fStack_800.config.encryption_key.bytes[0x1a] = '\0';
  fStack_800.config.encryption_key.bytes[0x1b] = '\0';
  fStack_800.config.block_reusing_threshold._4_4_ = 1;
  fStack_800.config._180_4_ = 0;
  fStack_800.config.min_block_reuse_filesize._7_1_ = 0;
  pcVar19 = (char *)&pfStack_930;
  pfStack_958 = (fdb_kvs_handle *)0x117059;
  fdb_open((fdb_file_handle **)pcVar19,"./dummy1",
           (fdb_config *)(fStack_800.config.encryption_key.bytes + 4));
  pfVar18 = (fdb_kvs_handle *)&pfStack_948;
  pfStack_958 = (fdb_kvs_handle *)0x11706c;
  fdb_kvs_open_default
            ((fdb_file_handle *)pfStack_930,(fdb_kvs_handle **)pfVar18,(fdb_kvs_config *)pfVar15);
  pfStack_958 = (fdb_kvs_handle *)0x117082;
  fVar3 = fdb_set_log_callback(pfStack_948,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_958 = (fdb_kvs_handle *)0x11709d;
    fVar3 = fdb_set_kv(pfStack_948,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_001172ef;
    pcVar21 = auStack_918 + 0x18;
    pcVar19 = "body%d";
    unaff_R12 = &fStack_800.bub_ctx.handle;
    unaff_RBP = (fdb_kvs_handle *)0x0;
    do {
      pfStack_958 = (fdb_kvs_handle *)0x1170cf;
      sprintf(pcVar21,"key%d",unaff_RBP);
      pfStack_958 = (fdb_kvs_handle *)0x1170de;
      sprintf((char *)unaff_R12,"body%d",unaff_RBP);
      unaff_R13 = pfStack_948;
      pfStack_958 = (fdb_kvs_handle *)0x1170eb;
      pfVar18 = (fdb_kvs_handle *)strlen(pcVar21);
      pfStack_958 = (fdb_kvs_handle *)0x1170f6;
      sVar5 = strlen((char *)unaff_R12);
      pfStack_958 = (fdb_kvs_handle *)0x11710a;
      fVar3 = fdb_set_kv(unaff_R13,pcVar21,(size_t)pfVar18,unaff_R12,sVar5);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_958 = (fdb_kvs_handle *)0x1172d0;
        api_wrapper_test();
        goto LAB_001172d0;
      }
      uVar14 = (int)unaff_RBP + 1;
      unaff_RBP = (fdb_kvs_handle *)(ulong)uVar14;
    } while (uVar14 != 10);
    pfVar18 = (fdb_kvs_handle *)(auStack_918 + 0x18);
    pfStack_958 = (fdb_kvs_handle *)0x117134;
    sprintf((char *)pfVar18,"key%d",5);
    pfVar15 = pfStack_948;
    pfStack_958 = (fdb_kvs_handle *)0x117141;
    sVar5 = strlen((char *)pfVar18);
    pfStack_958 = (fdb_kvs_handle *)0x11714f;
    fVar3 = fdb_del_kv(pfVar15,pfVar18,sVar5);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001172f4;
    pfStack_958 = (fdb_kvs_handle *)0x117165;
    fVar3 = fdb_del_kv(pfStack_948,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_001172f9;
    pfVar15 = (fdb_kvs_handle *)(auStack_918 + 0x18);
    pcVar19 = (char *)&pfStack_940;
    unaff_R12 = &pfStack_938;
    unaff_RBP = &fStack_800;
    unaff_R13 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_958 = (fdb_kvs_handle *)0x11719c;
      sprintf((char *)pfVar15,"key%d",unaff_R13);
      pfVar18 = pfStack_948;
      pfStack_958 = (fdb_kvs_handle *)0x1171a9;
      sVar5 = strlen((char *)pfVar15);
      pfStack_958 = (fdb_kvs_handle *)0x1171bd;
      fVar3 = fdb_get_kv(pfVar18,pfVar15,sVar5,(void **)pcVar19,(size_t *)unaff_R12);
      if ((int)unaff_R13 == 5) {
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001172e5;
      }
      else {
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001172e0;
        pfStack_958 = (fdb_kvs_handle *)0x1171e9;
        sprintf((char *)unaff_RBP,"body%d",unaff_R13);
        pfVar18 = pfStack_940;
        pfStack_958 = (fdb_kvs_handle *)0x1171fe;
        iVar4 = bcmp(pfStack_940,unaff_RBP,(size_t)pfStack_938);
        if (iVar4 != 0) goto LAB_001172d0;
        pfStack_958 = (fdb_kvs_handle *)0x11720e;
        fdb_free_block(pfVar18);
      }
      uVar14 = (int)unaff_R13 + 1;
      unaff_R13 = (fdb_kvs_handle *)(ulong)uVar14;
    } while (uVar14 != 10);
    pfStack_958 = (fdb_kvs_handle *)0x117233;
    fVar3 = fdb_get_kv(pfStack_948,(void *)0x0,0,&pfStack_940,(size_t *)&pfStack_938);
    handle = pfStack_948;
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_001172fe;
    pfVar15 = (fdb_kvs_handle *)(auStack_918 + 0x18);
    pfStack_958 = (fdb_kvs_handle *)0x11724e;
    sVar5 = strlen((char *)pfVar15);
    pfStack_958 = (fdb_kvs_handle *)0x117261;
    fVar3 = fdb_get_kv(handle,pfVar15,sVar5,(void **)0x0,(size_t *)0x0);
    if (fVar3 == FDB_RESULT_INVALID_ARGS) {
      pfStack_958 = (fdb_kvs_handle *)0x117274;
      fdb_kvs_close(pfStack_948);
      pfStack_958 = (fdb_kvs_handle *)0x11727e;
      fdb_close((fdb_file_handle *)pfStack_930);
      pfStack_958 = (fdb_kvs_handle *)0x117283;
      fdb_shutdown();
      pfStack_958 = (fdb_kvs_handle *)0x117288;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (api_wrapper_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_958 = (fdb_kvs_handle *)0x1172b9;
      fprintf(_stderr,pcVar19,"API wrapper test");
      return;
    }
  }
  else {
LAB_001172ea:
    pfStack_958 = (fdb_kvs_handle *)0x1172ef;
    api_wrapper_test();
LAB_001172ef:
    pfStack_958 = (fdb_kvs_handle *)0x1172f4;
    api_wrapper_test();
LAB_001172f4:
    pfStack_958 = (fdb_kvs_handle *)0x1172f9;
    api_wrapper_test();
LAB_001172f9:
    pfStack_958 = (fdb_kvs_handle *)0x1172fe;
    api_wrapper_test();
LAB_001172fe:
    handle = pfVar18;
    pfStack_958 = (fdb_kvs_handle *)0x117303;
    api_wrapper_test();
  }
  pfStack_958 = (fdb_kvs_handle *)flush_before_commit_test;
  api_wrapper_test();
  pfStack_ee0 = (fdb_kvs_handle *)0x117325;
  pfStack_980 = handle;
  ppfStack_978 = unaff_R12;
  pfStack_970 = unaff_R13;
  pfStack_968 = pfVar15;
  ppfStack_960 = (fdb_kvs_handle **)pcVar19;
  pfStack_958 = unaff_RBP;
  gettimeofday(&tStack_ea8,(__timezone_ptr_t)0x0);
  pfStack_ee0 = (fdb_kvs_handle *)0x11732a;
  memleak_start();
  pfStack_ee0 = (fdb_kvs_handle *)0x117336;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_ee0 = (fdb_kvs_handle *)0x117346;
  fdb_get_default_config();
  pfStack_ee0 = (fdb_kvs_handle *)0x117356;
  fdb_get_default_kvs_config();
  fStack_c80.buffercache_size = 0;
  fStack_c80.wal_threshold = 5;
  fStack_c80.flags = 1;
  fStack_c80.purging_interval = 0;
  fStack_c80.compaction_threshold = '\0';
  fStack_c80.wal_flush_before_commit = true;
  pfStack_ee0 = (fdb_kvs_handle *)0x11739a;
  fdb_open(&pfStack_ec0,"dummy1",&fStack_c80);
  pfStack_ee0 = (fdb_kvs_handle *)0x1173ad;
  fdb_open(&pfStack_ec8,"dummy1",&fStack_c80);
  pfStack_ee0 = (fdb_kvs_handle *)0x1173be;
  fdb_kvs_open_default(pfStack_ec0,&pfStack_eb0,&fStack_da0);
  pfStack_ee0 = (fdb_kvs_handle *)0x1173d2;
  fdb_kvs_open_default(pfStack_ec8,&pfStack_eb8,&fStack_da0);
  pfStack_ee0 = (fdb_kvs_handle *)0x1173e8;
  fVar3 = fdb_set_log_callback(pfStack_eb8,logCallbackFunc,"flush_before_commit_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfVar12 = apfStack_e98;
    uVar9 = 0;
    do {
      pfStack_ee0 = (fdb_kvs_handle *)0x117414;
      sprintf(acStack_d88,"key%d",uVar9 & 0xffffffff);
      pfStack_ee0 = (fdb_kvs_handle *)0x117430;
      sprintf(acStack_a88,"meta%d",uVar9 & 0xffffffff);
      pfStack_ee0 = (fdb_kvs_handle *)0x11744c;
      sprintf(acStack_b88,"body%d",uVar9 & 0xffffffff);
      pfStack_ee0 = (fdb_kvs_handle *)0x117454;
      sVar5 = strlen(acStack_d88);
      pfStack_ee0 = (fdb_kvs_handle *)0x11745f;
      sVar6 = strlen(acStack_a88);
      pfStack_ee0 = (fdb_kvs_handle *)0x11746a;
      sVar7 = strlen(acStack_b88);
      pfStack_ee0 = (fdb_kvs_handle *)0x11748a;
      fdb_doc_create(ppfVar12,acStack_d88,sVar5,acStack_a88,sVar6,acStack_b88,sVar7);
      uVar9 = uVar9 + 1;
      ppfVar12 = ppfVar12 + 1;
    } while (uVar9 != 0x1e);
    pfStack_ee0 = (fdb_kvs_handle *)0x1174aa;
    fdb_begin_transaction(pfStack_ec8,'\x02');
    lVar10 = 0;
    do {
      pfStack_ee0 = (fdb_kvs_handle *)0x1174bb;
      fdb_set(pfStack_eb0,apfStack_e98[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    lVar10 = 0;
    pfStack_ee0 = (fdb_kvs_handle *)0x1174d2;
    fdb_commit(pfStack_ec0,'\0');
    do {
      pfStack_ee0 = (fdb_kvs_handle *)0x1174e1;
      fdb_set(pfStack_eb8,apfStack_e98[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    lVar10 = 0;
    pfStack_ee0 = (fdb_kvs_handle *)0x1174f8;
    fdb_end_transaction(pfStack_ec8,'\0');
    pfStack_ee0 = (fdb_kvs_handle *)0x117507;
    fdb_commit(pfStack_ec0,'\x01');
    pfStack_ee0 = (fdb_kvs_handle *)0x117516;
    fdb_begin_transaction(pfStack_ec8,'\x02');
    do {
      pfStack_ee0 = (fdb_kvs_handle *)0x117525;
      fdb_set(pfStack_eb8,apfStack_e98[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    lVar10 = 0;
    pfStack_ee0 = (fdb_kvs_handle *)0x11753c;
    fdb_end_transaction(pfStack_ec8,'\0');
    do {
      pfStack_ee0 = (fdb_kvs_handle *)0x11754b;
      fdb_set(pfStack_eb0,apfStack_e98[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    lVar10 = 0;
    pfStack_ee0 = (fdb_kvs_handle *)0x117562;
    fdb_commit(pfStack_ec0,'\0');
    pfStack_ee0 = (fdb_kvs_handle *)0x117571;
    fdb_commit(pfStack_ec0,'\x01');
    pfStack_ee0 = (fdb_kvs_handle *)0x117580;
    fdb_begin_transaction(pfStack_ec8,'\x02');
    do {
      pfStack_ee0 = (fdb_kvs_handle *)0x11758f;
      fdb_set(pfStack_eb8,apfStack_e98[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    lVar10 = 0;
    do {
      pfStack_ee0 = (fdb_kvs_handle *)0x1175a9;
      fdb_set(pfStack_eb0,apfStack_e98[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    lVar10 = 0;
    pfStack_ee0 = (fdb_kvs_handle *)0x1175c0;
    fdb_commit(pfStack_ec0,'\0');
    pfStack_ee0 = (fdb_kvs_handle *)0x1175cc;
    fdb_end_transaction(pfStack_ec8,'\0');
    pfStack_ee0 = (fdb_kvs_handle *)0x1175db;
    fdb_commit(pfStack_ec0,'\x01');
    pfStack_ee0 = (fdb_kvs_handle *)0x1175ea;
    fdb_begin_transaction(pfStack_ec8,'\x02');
    do {
      pfStack_ee0 = (fdb_kvs_handle *)0x1175f9;
      fdb_set(pfStack_eb0,apfStack_e98[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    lVar10 = 0;
    do {
      pfStack_ee0 = (fdb_kvs_handle *)0x117613;
      fdb_set(pfStack_eb8,apfStack_e98[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    lVar10 = 0;
    pfStack_ee0 = (fdb_kvs_handle *)0x11762a;
    fdb_end_transaction(pfStack_ec8,'\0');
    pfStack_ee0 = (fdb_kvs_handle *)0x117636;
    fdb_commit(pfStack_ec0,'\0');
    pfStack_ee0 = (fdb_kvs_handle *)0x117645;
    fdb_commit(pfStack_ec0,'\x01');
    pfStack_ee0 = (fdb_kvs_handle *)0x117654;
    fdb_begin_transaction(pfStack_ec8,'\x02');
    do {
      pfStack_ee0 = (fdb_kvs_handle *)0x117663;
      fdb_set(pfStack_eb8,apfStack_e98[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 10);
    lVar10 = 0;
    do {
      pfStack_ee0 = (fdb_kvs_handle *)0x117680;
      fdb_set(pfStack_eb0,apfStack_e98[lVar10 + 10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 10);
    pfStack_ee0 = (fdb_kvs_handle *)0x11769a;
    fdb_compact(pfStack_ec0,"dummy2");
    lVar10 = 0;
    do {
      pfStack_ee0 = (fdb_kvs_handle *)0x1176ae;
      fdb_set(pfStack_eb8,apfStack_e98[lVar10 + 0x14]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 5);
    lVar10 = 0;
    pfStack_ee0 = (fdb_kvs_handle *)0x1176c5;
    fdb_end_transaction(pfStack_ec8,'\0');
    do {
      pfStack_ee0 = (fdb_kvs_handle *)0x1176d7;
      fdb_set(pfStack_eb0,apfStack_e98[lVar10 + 0x19]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 5);
    pfStack_ee0 = (fdb_kvs_handle *)0x1176ea;
    fdb_close(pfStack_ec0);
    pfStack_ee0 = (fdb_kvs_handle *)0x1176f4;
    fdb_close(pfStack_ec8);
    lVar10 = 0;
    do {
      pfStack_ee0 = (fdb_kvs_handle *)0x117700;
      fdb_doc_free(apfStack_e98[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x1e);
    pfStack_ee0 = (fdb_kvs_handle *)0x11770e;
    fdb_shutdown();
    pfStack_ee0 = (fdb_kvs_handle *)0x117713;
    memleak_end();
    pcVar19 = "%s PASSED\n";
    if (flush_before_commit_test()::__test_pass != '\0') {
      pcVar19 = "%s FAILED\n";
    }
    pfStack_ee0 = (fdb_kvs_handle *)0x117744;
    fprintf(_stderr,pcVar19,"flush before commit test");
    return;
  }
  pfStack_ee0 = (fdb_kvs_handle *)flush_before_commit_multi_writers_test;
  flush_before_commit_test();
  pcStack_ee8 = "dummy1";
  pfStack_13b8 = (fdb_encryption_key *)0x11777e;
  pfStack_f08 = &fStack_da0;
  ppfStack_f00 = &pfStack_ec0;
  ppfStack_ef8 = &pfStack_ec8;
  ppfStack_ef0 = &pfStack_eb8;
  pfStack_ee0 = unaff_RBP;
  gettimeofday(&tStack_1310,(__timezone_ptr_t)0x0);
  pfStack_13b8 = (fdb_encryption_key *)0x117783;
  memleak_start();
  pfStack_13a8 = (fdb_doc *)0x0;
  pfStack_13b8 = (fdb_encryption_key *)0x117794;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_13b8 = (fdb_encryption_key *)0x1177a4;
  fdb_get_default_config();
  fStack_1000.buffercache_size = 0;
  fStack_1000.wal_threshold = 8;
  fStack_1000.flags = 1;
  fStack_1000.purging_interval = 0;
  fStack_1000.compaction_threshold = '\0';
  fStack_1000.wal_flush_before_commit = true;
  pfStack_13b8 = (fdb_encryption_key *)0x1177d6;
  fdb_get_default_kvs_config();
  pfStack_13b8 = (fdb_encryption_key *)0x1177ed;
  fdb_open(&pfStack_1390,"dummy1",&fStack_1000);
  pfStack_13b8 = (fdb_encryption_key *)0x1177ff;
  fdb_kvs_open(pfStack_1390,&pfStack_13a0,(char *)0x0,&fStack_1328);
  lVar10 = 0;
  uVar9 = 0;
  do {
    ppfVar8 = &fStack_1300.bub_ctx.handle;
    pfStack_13b8 = (fdb_encryption_key *)0x11781f;
    sprintf((char *)ppfVar8,"key%d",uVar9 & 0xffffffff);
    pfStack_13b8 = (fdb_encryption_key *)0x117837;
    sprintf((char *)&fStack_1300.config.encryption_key,"meta%d",uVar9 & 0xffffffff);
    pfStack_13b8 = (fdb_encryption_key *)0x11784f;
    sprintf((char *)&fStack_1300,"body%d",uVar9 & 0xffffffff);
    pfStack_13b8 = (fdb_encryption_key *)0x11785f;
    sVar5 = strlen((char *)ppfVar8);
    pfVar16 = &fStack_1300.config.encryption_key;
    pfStack_13b8 = (fdb_encryption_key *)0x117872;
    sVar6 = strlen((char *)pfVar16);
    pfStack_13b8 = (fdb_encryption_key *)0x117882;
    sVar7 = strlen((char *)&fStack_1300);
    pfStack_13b8 = (fdb_encryption_key *)0x1178a7;
    fdb_doc_create((fdb_doc **)((long)apfStack_1380 + lVar10),&fStack_1300.bub_ctx.handle,sVar5,
                   pfVar16,sVar6,&fStack_1300,sVar7);
    pfStack_13b8 = (fdb_encryption_key *)0x1178b6;
    fdb_set(pfStack_13a0,apfStack_1380[uVar9]);
    uVar9 = uVar9 + 1;
    lVar10 = lVar10 + 8;
  } while (uVar9 != 10);
  pfStack_13b8 = (fdb_encryption_key *)0x1178d6;
  fdb_commit(pfStack_1390,'\x01');
  pfStack_13b8 = (fdb_encryption_key *)0x1178f2;
  fdb_open(&pfStack_1388,"dummy1",&fStack_1000);
  pfStack_13b8 = (fdb_encryption_key *)0x117909;
  fdb_kvs_open(pfStack_1388,&pfStack_1398,(char *)0x0,&fStack_1328);
  pfVar16 = &fStack_1300.config.encryption_key;
  lVar10 = 0;
  uVar9 = 0;
  do {
    pfStack_13b8 = (fdb_encryption_key *)0x117932;
    sprintf((char *)pfVar16,"meta2%d",uVar9 & 0xffffffff);
    pfStack_13b8 = (fdb_encryption_key *)0x117946;
    sprintf((char *)&fStack_1300,"body2%d(db2)",uVar9 & 0xffffffff);
    pfStack_13b8 = (fdb_encryption_key *)0x117956;
    sVar5 = strlen((char *)pfVar16);
    pfStack_13b8 = (fdb_encryption_key *)0x117961;
    sVar6 = strlen((char *)&fStack_1300);
    pfStack_13b8 = (fdb_encryption_key *)0x117975;
    fdb_doc_update((fdb_doc **)((long)apfStack_1380 + lVar10),pfVar16,sVar5,&fStack_1300,sVar6);
    pfStack_13b8 = (fdb_encryption_key *)0x117984;
    fdb_set(pfStack_1398,apfStack_1380[uVar9]);
    uVar9 = uVar9 + 1;
    lVar10 = lVar10 + 8;
  } while (uVar9 != 5);
  uVar9 = 5;
  lVar10 = 0x28;
  pfVar16 = &fStack_1300.config.encryption_key;
  pfVar18 = &fStack_1300;
  do {
    pfStack_13b8 = (fdb_encryption_key *)0x1179c6;
    sprintf((char *)pfVar16,"meta2%d",uVar9 & 0xffffffff);
    pfStack_13b8 = (fdb_encryption_key *)0x1179d5;
    sprintf((char *)pfVar18,"body2%d(db1)",uVar9 & 0xffffffff);
    pfStack_13b8 = (fdb_encryption_key *)0x1179e5;
    sVar5 = strlen((char *)pfVar16);
    pfStack_13b8 = (fdb_encryption_key *)0x1179f0;
    sVar6 = strlen((char *)pfVar18);
    pfStack_13b8 = (fdb_encryption_key *)0x117a0b;
    fdb_doc_update((fdb_doc **)((long)apfStack_1380 + lVar10),pfVar16,sVar5,pfVar18,sVar6);
    pfStack_13b8 = (fdb_encryption_key *)0x117a1a;
    fdb_set(pfStack_13a0,apfStack_1380[uVar9]);
    uVar9 = uVar9 + 1;
    lVar10 = lVar10 + 8;
  } while (uVar9 != 10);
  ppfVar8 = &fStack_1300.bub_ctx.handle;
  pfVar16 = &fStack_1300.config.encryption_key;
  uVar9 = 0;
  do {
    pcVar19 = "body2%d(db1)";
    pfStack_13b8 = (fdb_encryption_key *)0x117a54;
    sprintf((char *)ppfVar8,"key%d",uVar9);
    pfStack_13b8 = (fdb_encryption_key *)0x117a67;
    sprintf((char *)pfVar16,"meta2%d",uVar9);
    if ((uint)uVar9 < 5) {
      pcVar19 = "body2%d(db2)";
    }
    pfStack_13b8 = (fdb_encryption_key *)0x117a84;
    sprintf((char *)&fStack_1300,pcVar19,uVar9);
    pfStack_13b8 = (fdb_encryption_key *)0x117a8c;
    sVar5 = strlen((char *)ppfVar8);
    pfStack_13b8 = (fdb_encryption_key *)0x117aac;
    fdb_doc_create(&pfStack_13a8,ppfVar8,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_13b8 = (fdb_encryption_key *)0x117abb;
    fVar3 = fdb_get(pfStack_13a0,pfStack_13a8);
    pfVar17 = pfStack_13a8;
    if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00117dc9:
      pfStack_13b8 = (fdb_encryption_key *)0x117dce;
      flush_before_commit_multi_writers_test();
LAB_00117dce:
      pfStack_13b8 = (fdb_encryption_key *)0x117dd3;
      flush_before_commit_multi_writers_test();
      pfVar17 = (fdb_doc *)pcVar19;
LAB_00117dd3:
      pfStack_13b8 = (fdb_encryption_key *)0x117de3;
      flush_before_commit_multi_writers_test();
LAB_00117de3:
      pfStack_13b8 = (fdb_encryption_key *)0x117df3;
      flush_before_commit_multi_writers_test();
LAB_00117df3:
      pfStack_13b8 = (fdb_encryption_key *)0x117e03;
      flush_before_commit_multi_writers_test();
      goto LAB_00117e03;
    }
    pfVar18 = (fdb_kvs_handle *)pfStack_13a8->meta;
    pfStack_13b8 = (fdb_encryption_key *)0x117adb;
    iVar4 = bcmp(pfVar16,pfVar18,pfStack_13a8->metalen);
    if (iVar4 != 0) {
      pfStack_13b8 = (fdb_encryption_key *)0x117dc9;
      flush_before_commit_multi_writers_test();
      pcVar19 = (char *)pfVar17;
      goto LAB_00117dc9;
    }
    pfVar18 = (fdb_kvs_handle *)pfVar17->body;
    pfStack_13b8 = (fdb_encryption_key *)0x117af6;
    iVar4 = bcmp(&fStack_1300,pfVar18,pfVar17->bodylen);
    if (iVar4 != 0) goto LAB_00117dd3;
    pfStack_13b8 = (fdb_encryption_key *)0x117b06;
    fdb_doc_free(pfVar17);
    pcVar19 = (char *)0x0;
    pfStack_13a8 = (fdb_doc *)0x0;
    pfStack_13b8 = (fdb_encryption_key *)0x117b16;
    sVar5 = strlen((char *)ppfVar8);
    pfStack_13b8 = (fdb_encryption_key *)0x117b32;
    fdb_doc_create(&pfStack_13a8,ppfVar8,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_13b8 = (fdb_encryption_key *)0x117b41;
    fVar3 = fdb_get(pfStack_1398,pfStack_13a8);
    pfVar17 = pfStack_13a8;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117dce;
    pfVar18 = (fdb_kvs_handle *)pfStack_13a8->meta;
    pfStack_13b8 = (fdb_encryption_key *)0x117b61;
    iVar4 = bcmp(pfVar16,pfVar18,pfStack_13a8->metalen);
    if (iVar4 != 0) goto LAB_00117df3;
    pfVar18 = (fdb_kvs_handle *)pfVar17->body;
    pfStack_13b8 = (fdb_encryption_key *)0x117b7c;
    iVar4 = bcmp(&fStack_1300,pfVar18,pfVar17->bodylen);
    if (iVar4 != 0) goto LAB_00117de3;
    pfStack_13b8 = (fdb_encryption_key *)0x117b8c;
    fdb_doc_free(pfVar17);
    pfStack_13a8 = (fdb_doc *)0x0;
    uVar14 = (uint)uVar9 + 1;
    uVar9 = (ulong)uVar14;
  } while (uVar14 != 10);
  pfStack_13b8 = (fdb_encryption_key *)0x117bb3;
  fdb_commit(pfStack_1390,'\0');
  pfStack_13b8 = (fdb_encryption_key *)0x117bbf;
  fdb_commit(pfStack_1388,'\0');
  ppfVar8 = &fStack_1300.bub_ctx.handle;
  pfVar16 = &fStack_1300.config.encryption_key;
  uVar9 = 0;
  while( true ) {
    pfStack_13b8 = (fdb_encryption_key *)0x117bf3;
    sprintf((char *)ppfVar8,"key%d",uVar9);
    pfStack_13b8 = (fdb_encryption_key *)0x117c06;
    sprintf((char *)pfVar16,"meta2%d",uVar9);
    pcVar19 = "body2%d(db1)";
    if ((uint)uVar9 < 5) {
      pcVar19 = "body2%d(db2)";
    }
    pfStack_13b8 = (fdb_encryption_key *)0x117c20;
    sprintf((char *)&fStack_1300,pcVar19,uVar9);
    pfStack_13b8 = (fdb_encryption_key *)0x117c28;
    sVar5 = strlen((char *)ppfVar8);
    pfStack_13b8 = (fdb_encryption_key *)0x117c48;
    fdb_doc_create(&pfStack_13a8,ppfVar8,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_13b8 = (fdb_encryption_key *)0x117c57;
    fVar3 = fdb_get(pfStack_13a0,pfStack_13a8);
    pfVar17 = pfStack_13a8;
    pfVar13 = (fdb_doc *)"body2%d(db2)";
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pfVar18 = (fdb_kvs_handle *)pfStack_13a8->meta;
    pfStack_13b8 = (fdb_encryption_key *)0x117c77;
    iVar4 = bcmp(pfVar16,pfVar18,pfStack_13a8->metalen);
    if (iVar4 != 0) goto LAB_00117e03;
    pfVar18 = (fdb_kvs_handle *)pfVar17->body;
    pfStack_13b8 = (fdb_encryption_key *)0x117c92;
    iVar4 = bcmp(&fStack_1300,pfVar18,pfVar17->bodylen);
    if (iVar4 != 0) goto LAB_00117e1d;
    pfStack_13b8 = (fdb_encryption_key *)0x117ca2;
    fdb_doc_free(pfVar17);
    pfVar13 = (fdb_doc *)0x0;
    pfStack_13a8 = (fdb_doc *)0x0;
    pfStack_13b8 = (fdb_encryption_key *)0x117cb2;
    sVar5 = strlen((char *)ppfVar8);
    pfStack_13b8 = (fdb_encryption_key *)0x117cce;
    fdb_doc_create(&pfStack_13a8,ppfVar8,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_13b8 = (fdb_encryption_key *)0x117cdd;
    fVar3 = fdb_get(pfStack_1398,pfStack_13a8);
    pfVar17 = pfStack_13a8;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e18;
    pfVar18 = (fdb_kvs_handle *)pfStack_13a8->meta;
    pfStack_13b8 = (fdb_encryption_key *)0x117cfd;
    iVar4 = bcmp(pfVar16,pfVar18,pfStack_13a8->metalen);
    if (iVar4 != 0) goto LAB_00117e3d;
    pfVar18 = (fdb_kvs_handle *)pfVar17->body;
    pfStack_13b8 = (fdb_encryption_key *)0x117d18;
    iVar4 = bcmp(&fStack_1300,pfVar18,pfVar17->bodylen);
    if (iVar4 != 0) goto LAB_00117e2d;
    pfStack_13b8 = (fdb_encryption_key *)0x117d28;
    fdb_doc_free(pfVar17);
    pfStack_13a8 = (fdb_doc *)0x0;
    uVar14 = (uint)uVar9 + 1;
    uVar9 = (ulong)uVar14;
    if (uVar14 == 10) {
      pfStack_13b8 = (fdb_encryption_key *)0x117d4d;
      fdb_close(pfStack_1390);
      pfStack_13b8 = (fdb_encryption_key *)0x117d57;
      fdb_close(pfStack_1388);
      lVar10 = 0;
      do {
        pfStack_13b8 = (fdb_encryption_key *)0x117d63;
        fdb_doc_free(apfStack_1380[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 10);
      pfStack_13b8 = (fdb_encryption_key *)0x117d71;
      fdb_shutdown();
      pfStack_13b8 = (fdb_encryption_key *)0x117d76;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (flush_before_commit_multi_writers_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_13b8 = (fdb_encryption_key *)0x117da7;
      fprintf(_stderr,pcVar19,"flush before commit with multi writers test");
      return;
    }
  }
LAB_00117e13:
  pfStack_13b8 = (fdb_encryption_key *)0x117e18;
  flush_before_commit_multi_writers_test();
LAB_00117e18:
  pfStack_13b8 = (fdb_encryption_key *)0x117e1d;
  flush_before_commit_multi_writers_test();
  pfVar17 = pfVar13;
LAB_00117e1d:
  pfStack_13b8 = (fdb_encryption_key *)0x117e2d;
  flush_before_commit_multi_writers_test();
LAB_00117e2d:
  pfStack_13b8 = (fdb_encryption_key *)0x117e3d;
  flush_before_commit_multi_writers_test();
LAB_00117e3d:
  pfVar15 = &fStack_1300;
  ppfVar8 = &fStack_1300.bub_ctx.handle;
  pfVar16 = &fStack_1300.config.encryption_key;
  pfStack_13b8 = (fdb_encryption_key *)auto_commit_test;
  flush_before_commit_multi_writers_test();
  pfStack_1730 = (fdb_encryption_key *)0x117e6a;
  uStack_13e0 = uVar9;
  ppfStack_13d8 = ppfVar8;
  pfStack_13d0 = pfVar18;
  pfStack_13c8 = pfVar17;
  pfStack_13c0 = pfVar15;
  pfStack_13b8 = pfVar16;
  gettimeofday((timeval *)(auStack_1708 + 0x20),(__timezone_ptr_t)0x0);
  pfStack_1730 = (fdb_encryption_key *)0x117e6f;
  memleak_start();
  pfStack_1730 = (fdb_encryption_key *)0x117e7b;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar11 = &fStack_14d8;
  pfStack_1730 = (fdb_encryption_key *)0x117e8b;
  fdb_get_default_config();
  pfStack_1730 = (fdb_encryption_key *)0x117e95;
  fdb_get_default_kvs_config();
  fStack_14d8.buffercache_size = 0;
  fStack_14d8.wal_threshold = 0x1000;
  fStack_14d8.flags = 1;
  fStack_14d8.durability_opt = '\x02';
  fStack_14d8.auto_commit = true;
  pfStack_1730 = (fdb_encryption_key *)0x117ec8;
  fVar3 = fdb_open(&pfStack_1718,"dummy1",pfVar11);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_1730 = (fdb_encryption_key *)0x117ee4;
    fVar3 = fdb_kvs_open_default(pfStack_1718,&pfStack_1720,(fdb_kvs_config *)(auStack_1708 + 8));
    pcVar19 = (char *)pfVar15;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118182;
    pcVar19 = "body%d";
    pfVar16 = (fdb_encryption_key *)0x0;
    do {
      pfStack_1730 = (fdb_encryption_key *)0x117f15;
      sprintf((char *)afStack_15d8,"key%d",pfVar16);
      pfStack_1730 = (fdb_encryption_key *)0x117f24;
      sprintf((char *)apfStack_16d8,"body%d",pfVar16);
      pfVar18 = pfStack_1720;
      pfStack_1730 = (fdb_encryption_key *)0x117f31;
      sVar5 = strlen((char *)afStack_15d8);
      pfVar11 = (fdb_config *)(sVar5 + 1);
      pfStack_1730 = (fdb_encryption_key *)0x117f3d;
      sVar5 = strlen((char *)apfStack_16d8);
      pfStack_1730 = (fdb_encryption_key *)0x117f52;
      fVar3 = fdb_set_kv(pfVar18,afStack_15d8,(size_t)pfVar11,apfStack_16d8,sVar5 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1730 = (fdb_encryption_key *)0x118159;
        auto_commit_test();
        goto LAB_00118159;
      }
      uVar14 = (int)pfVar16 + 1;
      pfVar16 = (fdb_encryption_key *)(ulong)uVar14;
    } while (uVar14 != 5000);
    pfVar17 = afStack_15d8;
    ppfVar8 = apfStack_16d8;
    pfVar18 = (fdb_kvs_handle *)auStack_1708;
    pfVar16 = (fdb_encryption_key *)auStack_1710;
    pfVar11 = (fdb_config *)0x0;
    do {
      pfStack_1730 = (fdb_encryption_key *)0x117f90;
      sprintf((char *)pfVar17,"key%d",pfVar11);
      pfStack_1730 = (fdb_encryption_key *)0x117fa3;
      sprintf((char *)ppfVar8,"body%d",pfVar11);
      pfVar15 = pfStack_1720;
      pfStack_1730 = (fdb_encryption_key *)0x117fb0;
      sVar5 = strlen((char *)pfVar17);
      pfStack_1730 = (fdb_encryption_key *)0x117fc5;
      fVar3 = fdb_get_kv(pfVar15,pfVar17,sVar5 + 1,(void **)pfVar18,(size_t *)pfVar16);
      pcVar19 = (char *)auStack_1708._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118166;
      pfStack_1730 = (fdb_encryption_key *)0x117fe2;
      iVar4 = bcmp((void *)auStack_1708._0_8_,ppfVar8,(size_t)auStack_1710);
      if (iVar4 != 0) goto LAB_00118159;
      pfStack_1730 = (fdb_encryption_key *)0x117ff2;
      fdb_free_block(pcVar19);
      uVar14 = (int)pfVar11 + 1;
      pfVar11 = (fdb_config *)(ulong)uVar14;
    } while (uVar14 != 5000);
    pfStack_1730 = (fdb_encryption_key *)0x118006;
    fVar3 = fdb_kvs_close(pfStack_1720);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118187;
    pfStack_1730 = (fdb_encryption_key *)0x118018;
    fVar3 = fdb_close(pfStack_1718);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011818c;
    pfStack_1730 = (fdb_encryption_key *)0x118039;
    fVar3 = fdb_open(&pfStack_1718,"dummy1",&fStack_14d8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118191;
    pfStack_1730 = (fdb_encryption_key *)0x118055;
    fVar3 = fdb_kvs_open_default(pfStack_1718,&pfStack_1720,(fdb_kvs_config *)(auStack_1708 + 8));
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118196;
    pfVar17 = afStack_15d8;
    ppfVar8 = apfStack_16d8;
    pfVar18 = (fdb_kvs_handle *)auStack_1708;
    pfVar16 = (fdb_encryption_key *)auStack_1710;
    pfVar11 = (fdb_config *)0x0;
    do {
      pfStack_1730 = (fdb_encryption_key *)0x118089;
      sprintf((char *)pfVar17,"key%d",pfVar11);
      pfStack_1730 = (fdb_encryption_key *)0x11809c;
      sprintf((char *)ppfVar8,"body%d",pfVar11);
      pfVar15 = pfStack_1720;
      pfStack_1730 = (fdb_encryption_key *)0x1180a9;
      sVar5 = strlen((char *)pfVar17);
      pfStack_1730 = (fdb_encryption_key *)0x1180be;
      fVar3 = fdb_get_kv(pfVar15,pfVar17,sVar5 + 1,(void **)pfVar18,(size_t *)pfVar16);
      pcVar19 = (char *)auStack_1708._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118178;
      pfStack_1730 = (fdb_encryption_key *)0x1180db;
      iVar4 = bcmp((void *)auStack_1708._0_8_,ppfVar8,(size_t)auStack_1710);
      if (iVar4 != 0) goto LAB_0011816b;
      pfStack_1730 = (fdb_encryption_key *)0x1180eb;
      fdb_free_block(pcVar19);
      uVar14 = (int)pfVar11 + 1;
      pfVar11 = (fdb_config *)(ulong)uVar14;
    } while (uVar14 != 5000);
    pfStack_1730 = (fdb_encryption_key *)0x1180ff;
    fVar3 = fdb_close(pfStack_1718);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_1730 = (fdb_encryption_key *)0x11810c;
      fdb_shutdown();
      pfStack_1730 = (fdb_encryption_key *)0x118111;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (auto_commit_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_1730 = (fdb_encryption_key *)0x118142;
      fprintf(_stderr,pcVar19,"auto commit test");
      return;
    }
  }
  else {
LAB_0011817d:
    pfStack_1730 = (fdb_encryption_key *)0x118182;
    auto_commit_test();
    pcVar19 = (char *)pfVar15;
LAB_00118182:
    pfStack_1730 = (fdb_encryption_key *)0x118187;
    auto_commit_test();
LAB_00118187:
    pfStack_1730 = (fdb_encryption_key *)0x11818c;
    auto_commit_test();
LAB_0011818c:
    pfStack_1730 = (fdb_encryption_key *)0x118191;
    auto_commit_test();
LAB_00118191:
    pfStack_1730 = (fdb_encryption_key *)0x118196;
    auto_commit_test();
LAB_00118196:
    pfStack_1730 = (fdb_encryption_key *)0x11819b;
    auto_commit_test();
  }
  pfStack_1730 = (fdb_encryption_key *)auto_commit_space_used_test;
  auto_commit_test();
  pcStack_19a8 = (code *)0x1181bd;
  pfStack_1758 = pfVar11;
  ppfStack_1750 = ppfVar8;
  pfStack_1748 = pfVar18;
  pfStack_1740 = pfVar17;
  pfStack_1738 = (fdb_kvs_handle *)pcVar19;
  pfStack_1730 = pfVar16;
  gettimeofday(&tStack_1958,(__timezone_ptr_t)0x0);
  pcStack_19a8 = (code *)0x1181c2;
  memleak_start();
  pcStack_19a8 = (code *)0x1181ce;
  system("rm -rf  func_test* > errorlog.txt");
  pcStack_19a8 = (code *)0x1181de;
  fdb_get_default_config();
  fStack_1850.buffercache_size = 0;
  fStack_1850.auto_commit = true;
  pcStack_19a8 = (code *)0x1181f7;
  fdb_get_default_config();
  pcStack_19a8 = (code *)0x118207;
  memcpy(&fStack_1850,afStack_1948,0xf8);
  pcStack_19a8 = (code *)0x118211;
  fdb_get_default_kvs_config();
  uVar9 = 0xfffffffc;
  while( true ) {
    builtin_strncpy(acStack_1990 + 8,"est1",5);
    builtin_strncpy(acStack_1990,"./func_t",8);
    pcStack_19a8 = (code *)0x11825c;
    fVar3 = fdb_open(&pfStack_19a0,acStack_1990,&fStack_1850);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pcStack_19a8 = (code *)0x118278;
    fVar3 = fdb_kvs_open(pfStack_19a0,&pfStack_1998,"justonekv",&fStack_1970);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_19a8 = (code *)0x118331;
      auto_commit_space_used_test();
      break;
    }
    pcStack_19a8 = (code *)0x11828e;
    fVar3 = fdb_get_file_info(pfStack_19a0,afStack_1948);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011833b;
    if (afStack_1948[0].file_size != fStack_1850.blocksize * 7) {
      pcStack_19a8 = (code *)0x1182dd;
      auto_commit_space_used_test();
    }
    pcStack_19a8 = (code *)0x1182b9;
    fVar3 = fdb_close(pfStack_19a0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118336;
    uVar14 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar14;
    if (uVar14 == 0) {
      pcStack_19a8 = (code *)0x1182e4;
      fdb_shutdown();
      pcStack_19a8 = (code *)0x1182e9;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (auto_commit_space_used_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pcStack_19a8 = (code *)0x11831a;
      fprintf(_stderr,pcVar19,"auto_commit space used on close test");
      return;
    }
  }
  pcStack_19a8 = (code *)0x118336;
  auto_commit_space_used_test();
LAB_00118336:
  pcStack_19a8 = (code *)0x11833b;
  auto_commit_space_used_test();
LAB_0011833b:
  pcStack_19a8 = last_wal_flush_header_test;
  auto_commit_space_used_test();
  uStack_19b0 = 0x745f636e75662f2e;
  pcStack_19c0 = "justonekv";
  ppfStack_1f40 = (fdb_kvs_handle **)0x118363;
  ppfStack_19d0 = &pfStack_1998;
  pcStack_19c8 = acStack_1990;
  uStack_19b8 = uVar9;
  pcStack_19a8 = (code *)&pfStack_19a0;
  gettimeofday(&tStack_1de0,(__timezone_ptr_t)0x0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118368;
  memleak_start();
  pfStack_1f28 = (fdb_doc *)0x0;
  ppfStack_1f40 = (fdb_kvs_handle **)0x118379;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_1f40 = (fdb_kvs_handle **)0x118389;
  fdb_get_default_config();
  ppfStack_1f40 = (fdb_kvs_handle **)0x118396;
  fdb_get_default_kvs_config();
  fStack_1dd0.buffercache_size = 0;
  fStack_1dd0.flags = 1;
  fStack_1dd0.purging_interval = 0;
  fStack_1dd0.compaction_threshold = '\0';
  ppfStack_1f40 = (fdb_kvs_handle **)0x1183c9;
  fdb_open((fdb_file_handle **)(auStack_1f18 + 0x10),"dummy1",&fStack_1dd0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1183dc;
  fdb_open((fdb_file_handle **)auStack_1f18,"dummy1",&fStack_1dd0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1183ed;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1f18._16_8_,&pfStack_1f20,&fStack_1ef0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1183fe;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1f18._0_8_,(fdb_kvs_handle **)(auStack_1f18 + 8),
             &fStack_1ef0);
  ppfVar12 = apfStack_1ed8;
  uVar9 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x118422;
    sprintf(acStack_1cd8,"key%d",uVar9 & 0xffffffff);
    ppfStack_1f40 = (fdb_kvs_handle **)0x11843e;
    sprintf(acStack_1ad8,"meta%d",uVar9 & 0xffffffff);
    ptr_fhandle = apfStack_1bd8;
    ppfStack_1f40 = (fdb_kvs_handle **)0x11845a;
    sprintf((char *)ptr_fhandle,"body%d",uVar9 & 0xffffffff);
    ppfStack_1f40 = (fdb_kvs_handle **)0x118462;
    ppfVar8 = (fdb_kvs_handle **)strlen(acStack_1cd8);
    ppfStack_1f40 = (fdb_kvs_handle **)0x11846d;
    sVar5 = strlen(acStack_1ad8);
    ppfStack_1f40 = (fdb_kvs_handle **)0x118478;
    sVar6 = strlen((char *)ptr_fhandle);
    ppfStack_1f40 = (fdb_kvs_handle **)0x118498;
    fdb_doc_create(ppfVar12,acStack_1cd8,(size_t)ppfVar8,acStack_1ad8,sVar5,ptr_fhandle,sVar6);
    uVar9 = uVar9 + 1;
    ppfVar12 = ppfVar12 + 1;
  } while (uVar9 != 0x1e);
  lVar10 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x1184ba;
    fdb_set(pfStack_1f20,apfStack_1ed8[lVar10]);
    lVar10 = lVar10 + 1;
  } while (lVar10 == 1);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1184d2;
  fdb_begin_transaction((fdb_file_handle *)auStack_1f18._0_8_,'\x02');
  lVar10 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x1184e3;
    fdb_set((fdb_kvs_handle *)auStack_1f18._8_8_,apfStack_1ed8[lVar10 + 2]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1184fe;
  fdb_commit((fdb_file_handle *)auStack_1f18._16_8_,'\x01');
  ppfStack_1f40 = (fdb_kvs_handle **)0x118506;
  fdb_close((fdb_file_handle *)auStack_1f18._16_8_);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118513;
  fdb_close((fdb_file_handle *)auStack_1f18._0_8_);
  ppfVar20 = (fdb_kvs_handle **)0x1551a5;
  pfVar11 = &fStack_1dd0;
  ppfStack_1f40 = (fdb_kvs_handle **)0x118530;
  fdb_open((fdb_file_handle **)(auStack_1f18 + 0x10),"dummy1",pfVar11);
  ppfStack_1f40 = (fdb_kvs_handle **)0x11853e;
  fdb_open((fdb_file_handle **)auStack_1f18,"dummy1",pfVar11);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118553;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1f18._16_8_,&pfStack_1f20,&fStack_1ef0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118563;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1f18._0_8_,(fdb_kvs_handle **)(auStack_1f18 + 8),
             &fStack_1ef0);
  uVar9 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x11858f;
    fdb_doc_create(&pfStack_1f28,apfStack_1ed8[uVar9]->key,apfStack_1ed8[uVar9]->keylen,(void *)0x0,
                   0,(void *)0x0,0);
    ppfStack_1f40 = (fdb_kvs_handle **)0x11859e;
    fVar3 = fdb_get(pfStack_1f20,pfStack_1f28);
    if (uVar9 < 2) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118b46;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118b4b;
    ppfStack_1f40 = (fdb_kvs_handle **)0x1185bf;
    fdb_doc_free(pfStack_1f28);
    pfStack_1f28 = (fdb_doc *)0x0;
    uVar9 = uVar9 + 1;
  } while (uVar9 != 4);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1185e0;
  fdb_begin_transaction((fdb_file_handle *)auStack_1f18._0_8_,'\x02');
  lVar10 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x1185f1;
    fdb_set((fdb_kvs_handle *)auStack_1f18._8_8_,apfStack_1ed8[lVar10 + 2]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  lVar10 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x11860e;
    fdb_set(pfStack_1f20,apfStack_1ed8[lVar10 + 4]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118629;
  fdb_end_transaction((fdb_file_handle *)auStack_1f18._0_8_,'\x01');
  ppfStack_1f40 = (fdb_kvs_handle **)0x118636;
  fdb_close((fdb_file_handle *)auStack_1f18._16_8_);
  ppfStack_1f40 = (fdb_kvs_handle **)0x11863e;
  fdb_close((fdb_file_handle *)auStack_1f18._0_8_);
  ppfVar20 = (fdb_kvs_handle **)0x1551a5;
  pfVar11 = &fStack_1dd0;
  ppfStack_1f40 = (fdb_kvs_handle **)0x11865b;
  fdb_open((fdb_file_handle **)(auStack_1f18 + 0x10),"dummy1",pfVar11);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118669;
  fdb_open((fdb_file_handle **)auStack_1f18,"dummy1",pfVar11);
  ppfStack_1f40 = (fdb_kvs_handle **)0x11867e;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1f18._16_8_,&pfStack_1f20,&fStack_1ef0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x11868e;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1f18._0_8_,(fdb_kvs_handle **)(auStack_1f18 + 8),
             &fStack_1ef0);
  uVar9 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x1186ba;
    fdb_doc_create(&pfStack_1f28,apfStack_1ed8[uVar9]->key,apfStack_1ed8[uVar9]->keylen,(void *)0x0,
                   0,(void *)0x0,0);
    ppfStack_1f40 = (fdb_kvs_handle **)0x1186c9;
    fVar3 = fdb_get(pfStack_1f20,pfStack_1f28);
    if ((uVar9 < 4) && (fVar3 != FDB_RESULT_SUCCESS)) {
      ppfStack_1f40 = (fdb_kvs_handle **)0x118b41;
      last_wal_flush_header_test();
      goto LAB_00118b41;
    }
    ppfStack_1f40 = (fdb_kvs_handle **)0x1186e1;
    fdb_doc_free(pfStack_1f28);
    pfStack_1f28 = (fdb_doc *)0x0;
    uVar9 = uVar9 + 1;
  } while (uVar9 != 6);
  lVar10 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x118707;
    fdb_set(pfStack_1f20,apfStack_1ed8[lVar10 + 4]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_1f40 = (fdb_kvs_handle **)0x11871f;
  fdb_begin_transaction((fdb_file_handle *)auStack_1f18._0_8_,'\x02');
  lVar10 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x118733;
    fdb_set((fdb_kvs_handle *)auStack_1f18._8_8_,apfStack_1ed8[lVar10 + 6]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_1f40 = (fdb_kvs_handle **)0x11874b;
  fdb_commit((fdb_file_handle *)auStack_1f18._16_8_,'\x01');
  ppfStack_1f40 = (fdb_kvs_handle **)0x118767;
  fdb_open(&pfStack_1f00,"dummy1",&fStack_1dd0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118779;
  fdb_kvs_open_default(pfStack_1f00,&pfStack_1ef8,&fStack_1ef0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118786;
  fdb_begin_transaction(pfStack_1f00,'\x02');
  lVar10 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x11879a;
    fdb_set(pfStack_1ef8,apfStack_1ed8[lVar10 + 8]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1187b2;
  fdb_end_transaction(pfStack_1f00,'\x01');
  ppfStack_1f40 = (fdb_kvs_handle **)0x1187bf;
  fdb_close((fdb_file_handle *)auStack_1f18._16_8_);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1187c9;
  fdb_close((fdb_file_handle *)auStack_1f18._0_8_);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1187d3;
  fdb_close(pfStack_1f00);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1187ea;
  fdb_open((fdb_file_handle **)(auStack_1f18 + 0x10),"dummy1",&fStack_1dd0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1187fc;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1f18._16_8_,&pfStack_1f20,&fStack_1ef0);
  uVar9 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x118828;
    fdb_doc_create(&pfStack_1f28,apfStack_1ed8[uVar9]->key,apfStack_1ed8[uVar9]->keylen,(void *)0x0,
                   0,(void *)0x0,0);
    ppfStack_1f40 = (fdb_kvs_handle **)0x118837;
    fVar3 = fdb_get(pfStack_1f20,pfStack_1f28);
    if ((int)uVar9 - 8U < 0xfffffffe) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118b50;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118b55;
    ppfStack_1f40 = (fdb_kvs_handle **)0x11885b;
    fdb_doc_free(pfStack_1f28);
    pfStack_1f28 = (fdb_doc *)0x0;
    uVar9 = uVar9 + 1;
  } while (uVar9 != 10);
  pfVar11 = (fdb_config *)auStack_1f18;
  ppfStack_1f40 = (fdb_kvs_handle **)0x11888f;
  fdb_open((fdb_file_handle **)pfVar11,"dummy1",&fStack_1dd0);
  ptr_fhandle = &pfStack_1f00;
  ppfStack_1f40 = (fdb_kvs_handle **)0x1188a2;
  fdb_open(ptr_fhandle,"dummy1",&fStack_1dd0);
  ppfVar20 = (fdb_kvs_handle **)(auStack_1f18 + 8);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1188bb;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1f18._0_8_,ppfVar20,&fStack_1ef0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1188cf;
  fdb_kvs_open_default(pfStack_1f00,&pfStack_1ef8,&fStack_1ef0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1188dd;
  fdb_begin_transaction((fdb_file_handle *)auStack_1f18._0_8_,'\x02');
  ppfVar8 = &pfStack_1f20;
  ppfStack_1f40 = (fdb_kvs_handle **)0x1188f3;
  fdb_set(pfStack_1f20,apfStack_1ed8[10]);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118905;
  fdb_commit((fdb_file_handle *)auStack_1f18._16_8_,'\x01');
  ppfStack_1f40 = (fdb_kvs_handle **)0x118916;
  fdb_set(pfStack_1f20,apfStack_1ed8[0xb]);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118926;
  fdb_set((fdb_kvs_handle *)auStack_1f18._8_8_,apfStack_1ed8[0xc]);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118933;
  fdb_commit((fdb_file_handle *)auStack_1f18._16_8_,'\x01');
  ppfStack_1f40 = (fdb_kvs_handle **)0x118943;
  fdb_set((fdb_kvs_handle *)auStack_1f18._8_8_,apfStack_1ed8[0xd]);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118951;
  fdb_begin_transaction(pfStack_1f00,'\x02');
  ppfStack_1f40 = (fdb_kvs_handle **)0x118961;
  fdb_set(pfStack_1ef8,apfStack_1ed8[0xe]);
  ppfStack_1f40 = (fdb_kvs_handle **)0x11896f;
  fdb_end_transaction((fdb_file_handle *)auStack_1f18._0_8_,'\x01');
  ppfStack_1f40 = (fdb_kvs_handle **)0x11897f;
  fdb_set(pfStack_1ef8,apfStack_1ed8[0xf]);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118990;
  fdb_set(pfStack_1f20,apfStack_1ed8[0x10]);
  ppfStack_1f40 = (fdb_kvs_handle **)0x11899e;
  fdb_end_transaction(pfStack_1f00,'\x01');
  ppfStack_1f40 = (fdb_kvs_handle **)0x1189af;
  fdb_set(pfStack_1f20,apfStack_1ed8[0x11]);
  uVar9 = 0;
  ppfStack_1f40 = (fdb_kvs_handle **)0x1189bc;
  fdb_commit((fdb_file_handle *)auStack_1f18._16_8_,'\0');
  ppfStack_1f40 = (fdb_kvs_handle **)0x1189c4;
  fdb_close((fdb_file_handle *)auStack_1f18._16_8_);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1189cd;
  fdb_close((fdb_file_handle *)auStack_1f18._0_8_);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1189d6;
  fdb_close(pfStack_1f00);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1189ed;
  fdb_open((fdb_file_handle **)(auStack_1f18 + 0x10),"dummy1",&fStack_1dd0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1189fd;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1f18._16_8_,ppfVar8,&fStack_1ef0);
  while( true ) {
    ppfStack_1f40 = (fdb_kvs_handle **)0x118a29;
    fdb_doc_create(&pfStack_1f28,apfStack_1ed8[uVar9 + 10]->key,apfStack_1ed8[uVar9 + 10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1f40 = (fdb_kvs_handle **)0x118a38;
    fVar3 = fdb_get(pfStack_1f20,pfStack_1f28);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ppfStack_1f40 = (fdb_kvs_handle **)0x118a4a;
    fdb_doc_free(pfStack_1f28);
    pfStack_1f28 = (fdb_doc *)0x0;
    uVar9 = uVar9 + 1;
    if (uVar9 == 8) {
      ppfStack_1f40 = (fdb_kvs_handle **)0x118a78;
      fdb_open((fdb_file_handle **)auStack_1f18,"dummy1",&fStack_1dd0);
      ppfStack_1f40 = (fdb_kvs_handle **)0x118a8d;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_1f18._0_8_,(fdb_kvs_handle **)(auStack_1f18 + 8),
                 &fStack_1ef0);
      ppfStack_1f40 = (fdb_kvs_handle **)0x118a9a;
      fdb_begin_transaction((fdb_file_handle *)auStack_1f18._0_8_,'\x02');
      ppfStack_1f40 = (fdb_kvs_handle **)0x118aaa;
      fdb_set((fdb_kvs_handle *)auStack_1f18._8_8_,apfStack_1ed8[0x14]);
      ppfStack_1f40 = (fdb_kvs_handle **)0x118abb;
      fdb_compact((fdb_file_handle *)auStack_1f18._16_8_,"dummy2");
      ppfStack_1f40 = (fdb_kvs_handle **)0x118ac8;
      fdb_end_transaction((fdb_file_handle *)auStack_1f18._0_8_,'\x01');
      ppfStack_1f40 = (fdb_kvs_handle **)0x118ad2;
      fdb_close((fdb_file_handle *)auStack_1f18._16_8_);
      ppfStack_1f40 = (fdb_kvs_handle **)0x118ada;
      fdb_close((fdb_file_handle *)auStack_1f18._0_8_);
      lVar10 = 0;
      do {
        ppfStack_1f40 = (fdb_kvs_handle **)0x118ae6;
        fdb_doc_free(apfStack_1ed8[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x1e);
      ppfStack_1f40 = (fdb_kvs_handle **)0x118af4;
      fdb_shutdown();
      ppfStack_1f40 = (fdb_kvs_handle **)0x118af9;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      ppfStack_1f40 = (fdb_kvs_handle **)0x118b2a;
      fprintf(_stderr,pcVar19,"last wal flush header test");
      return;
    }
  }
LAB_00118b41:
  ppfStack_1f40 = (fdb_kvs_handle **)0x118b46;
  last_wal_flush_header_test();
LAB_00118b46:
  ppfStack_1f40 = (fdb_kvs_handle **)0x118b4b;
  last_wal_flush_header_test();
LAB_00118b4b:
  ppfStack_1f40 = (fdb_kvs_handle **)0x118b50;
  last_wal_flush_header_test();
LAB_00118b50:
  ppfStack_1f40 = (fdb_kvs_handle **)0x118b55;
  last_wal_flush_header_test();
LAB_00118b55:
  ppfStack_1f40 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_18188 = (fdb_doc *)0x118b77;
  ppfStack_1f68 = &pfStack_1f28;
  pfStack_1f60 = pfVar11;
  ppfStack_1f58 = ptr_fhandle;
  uStack_1f50 = uVar9;
  ppfStack_1f48 = ppfVar20;
  ppfStack_1f40 = ppfVar8;
  gettimeofday(&tStack_18120,(__timezone_ptr_t)0x0);
  pfStack_18188 = (fdb_doc *)0x118b7c;
  memleak_start();
  pfStack_18170 = (fdb_doc *)0x0;
  pfStack_18188 = (fdb_doc *)0x118b91;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_18188 = (fdb_doc *)0x118ba1;
  fdb_get_default_config();
  pfStack_18188 = (fdb_doc *)0x118bae;
  fdb_get_default_kvs_config();
  fStack_17ea8.flags = 1;
  fStack_17ea8.purging_interval = 0;
  fStack_17ea8.compaction_threshold = '\0';
  fStack_17ea8.durability_opt = '\x02';
  pfStack_18188 = (fdb_doc *)0x118bdb;
  fdb_open(&pfStack_18168,"dummy1",&fStack_17ea8);
  pfStack_18188 = (fdb_doc *)0x118beb;
  fdb_kvs_open_default(pfStack_18168,&pfStack_18158,&fStack_18110);
  ppfVar12 = apfStack_17cb0;
  pfVar17 = afStack_180b0;
  pfVar13 = (fdb_doc *)0x0;
  lVar10 = 0;
  do {
    sVar5 = 0xff7f;
    if (lVar10 == 1) {
      sVar5 = 0x1fff;
    }
    if (lVar10 == 0) {
      sVar5 = 0x7fff;
    }
    pfStack_18188 = (fdb_doc *)0x118c39;
    lStack_18150 = lVar10;
    memset(asStack_11ef0,0x5f,sVar5);
    *(undefined1 *)((long)asStack_11ef0 + sVar5) = 0;
    lVar10 = 0;
    doc_00 = ppfVar12;
    lStack_18148 = (long)pfVar13;
    ppfStack_18140 = ppfVar12;
    sStack_18128 = sVar5;
    do {
      pfStack_18188 = (fdb_doc *)0x118c6f;
      lStack_18138 = lVar10;
      sprintf((char *)pfVar17,"%08d");
      asStack_11ef0[0] = afStack_180b0[0].keylen;
      uVar9 = 0;
      lStack_18160 = (long)pfVar13;
      ppfStack_18130 = doc_00;
      do {
        pfStack_18188 = (fdb_doc *)0x118cab;
        sprintf((char *)pfVar17,"%08d",uVar9 & 0xffffffff);
        *(size_t *)((long)apfStack_17cb0 + sStack_18128 + 0x5db8) = afStack_180b0[0].keylen;
        uVar14 = (int)lStack_18160 + (int)uVar9;
        pfStack_18188 = (fdb_doc *)0x118ce4;
        sprintf(acStack_17db0,"meta%d",(ulong)uVar14);
        pfStack_18188 = (fdb_doc *)0x118cf7;
        sprintf(acStack_17fb0,"body%d",(ulong)uVar14);
        pfStack_18188 = (fdb_doc *)0x118d04;
        sVar5 = strlen((char *)asStack_11ef0);
        pfStack_18188 = (fdb_doc *)0x118d10;
        sVar6 = strlen(acStack_17db0);
        pfStack_18188 = (fdb_doc *)0x118d24;
        sVar7 = strlen(acStack_17fb0);
        lVar1 = lStack_18160;
        pcVar19 = acStack_17fb0;
        pfStack_18188 = (fdb_doc *)0x118d57;
        fdb_doc_create(doc_00,asStack_11ef0,sVar5 + 1,acStack_17db0,sVar6 + 1,pcVar19,sVar7 + 1);
        uVar9 = uVar9 + 1;
        doc_00 = doc_00 + 1;
      } while (uVar9 != 10);
      lVar10 = lStack_18138 + 1;
      doc_00 = ppfStack_18130 + 10;
      pfVar13 = (fdb_doc *)(lVar1 + 10);
    } while (lVar10 != 100);
    lVar10 = lStack_18150 + 1;
    ppfVar12 = ppfStack_18140 + 1000;
    pfVar13 = (fdb_doc *)(lStack_18148 + 1000);
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pfStack_18188 = (fdb_doc *)0x118dcd;
    fdb_set(pfStack_18158,apfStack_17cb0[lVar10]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3000);
  pfStack_18188 = (fdb_doc *)0x118de8;
  fdb_commit(pfStack_18168,'\x01');
  pfStack_18188 = (fdb_doc *)0x118dfd;
  fdb_get_file_info(pfStack_18168,&fStack_180f8);
  if (fStack_180f8.doc_count != 3000) {
    pfStack_18188 = (fdb_doc *)0x118e14;
    long_key_test();
  }
  lVar10 = 0;
  while( true ) {
    pfStack_18188 = (fdb_doc *)0x118e43;
    fdb_doc_create(&pfStack_18170,apfStack_17cb0[lVar10]->key,apfStack_17cb0[lVar10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_18188 = (fdb_doc *)0x118e52;
    fVar3 = fdb_get(pfStack_18158,pfStack_18170);
    doc = pfStack_18170;
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    doc_00 = (fdb_doc **)pfStack_18170->key;
    pfVar17 = apfStack_17cb0[lVar10];
    pcVar19 = (char *)pfVar17->key;
    pfStack_18188 = (fdb_doc *)0x118e7d;
    iVar4 = bcmp(doc_00,pcVar19,pfStack_18170->keylen);
    pfVar13 = doc;
    if (iVar4 != 0) {
      pfStack_18188 = (fdb_doc *)0x118f61;
      long_key_test();
      break;
    }
    doc_00 = (fdb_doc **)doc->meta;
    pcVar19 = (char *)pfVar17->meta;
    pfStack_18188 = (fdb_doc *)0x118e9c;
    iVar4 = bcmp(doc_00,pcVar19,doc->metalen);
    if (iVar4 != 0) goto LAB_00118f71;
    doc_00 = (fdb_doc **)doc->body;
    pcVar19 = (char *)pfVar17->body;
    pfStack_18188 = (fdb_doc *)0x118ebb;
    iVar4 = bcmp(doc_00,pcVar19,doc->bodylen);
    if (iVar4 != 0) goto LAB_00118f66;
    pfStack_18188 = (fdb_doc *)0x118ecb;
    fdb_doc_free(doc);
    pfStack_18170 = (fdb_doc *)0x0;
    lVar10 = lVar10 + 1;
    if (lVar10 == 3000) {
      pfStack_18188 = (fdb_doc *)0x118eee;
      fdb_close(pfStack_18168);
      lVar10 = 0;
      do {
        pfStack_18188 = (fdb_doc *)0x118efd;
        fdb_doc_free(apfStack_17cb0[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3000);
      pfStack_18188 = (fdb_doc *)0x118f0e;
      fdb_shutdown();
      pfStack_18188 = (fdb_doc *)0x118f13;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_18188 = (fdb_doc *)0x118f44;
      fprintf(_stderr,pcVar19,"long key test");
      return;
    }
  }
  pfStack_18188 = (fdb_doc *)0x118f66;
  long_key_test();
LAB_00118f66:
  pfStack_18188 = (fdb_doc *)0x118f71;
  long_key_test();
LAB_00118f71:
  pfStack_18188 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1c680 = (fdb_kvs_handle *)0x118f9c;
  ppfStack_181b0 = &pfStack_18170;
  pcStack_181a8 = pcVar19;
  lStack_181a0 = lVar10;
  pfStack_18198 = pfVar13;
  ppfStack_18190 = doc_00;
  pfStack_18188 = pfVar17;
  gettimeofday((timeval *)(auStack_1c638 + 0x70),(__timezone_ptr_t)0x0);
  pfStack_1c680 = (fdb_kvs_handle *)0x118fa1;
  memleak_start();
  pfStack_1c680 = (fdb_kvs_handle *)0x118fad;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1c680 = (fdb_kvs_handle *)0x118fbd;
  fdb_get_default_config();
  pfStack_1c680 = (fdb_kvs_handle *)0x118fc7;
  fdb_get_default_kvs_config();
  fStack_1c4b0.wal_threshold = 0x400;
  fStack_1c4b0.compaction_mode = '\0';
  fStack_1c4b0.durability_opt = '\x02';
  pcVar21 = (char *)&fStack_1c1b8;
  ppfVar20 = apfStack_1c3b8;
  pcVar19 = "kvs%d";
  uVar9 = 0;
  ppfVar8 = (fdb_kvs_handle **)0x0;
  do {
    pfStack_1c680 = (fdb_kvs_handle *)0x119007;
    sprintf((char *)ppfVar20,"dummy%d",(ulong)ppfVar8 & 0xffffffff);
    ptr_handle = (char *)(apfStack_1c5b8 + (long)ppfVar8 + -10);
    pfStack_1c680 = (fdb_kvs_handle *)0x119022;
    fVar3 = fdb_open((fdb_file_handle **)ptr_handle,(char *)ppfVar20,&fStack_1c4b0);
    pfVar18 = (fdb_kvs_handle *)pcVar21;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119452;
    ppfVar2 = (fdb_kvs_handle **)0x0;
    ppfStack_1c660 = ppfVar8;
    pfStack_1c658 = (fdb_kvs_handle *)pcVar21;
    do {
      ppfVar8 = ppfVar2;
      pfStack_1c680 = (fdb_kvs_handle *)0x119048;
      sprintf((char *)ppfVar20,"kvs%d",(ulong)(uint)((int)ppfVar8 + (int)uVar9));
      pfStack_1c680 = (fdb_kvs_handle *)0x11905b;
      fVar3 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)ptr_handle,
                           (fdb_kvs_handle **)pcVar21,(char *)ppfVar20,&fStack_1c650);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1c680 = (fdb_kvs_handle *)0x11943e;
        open_multi_files_kvs_test();
        goto LAB_0011943e;
      }
      pcVar21 = (char *)&(((fdb_kvs_handle *)pcVar21)->kvs_config).custom_cmp;
      ppfVar2 = (fdb_kvs_handle **)((long)ppfVar8 + 1);
    } while ((fdb_kvs_handle **)((long)ppfVar8 + 1) != (fdb_kvs_handle **)0x80);
    ppfVar8 = (fdb_kvs_handle **)((long)ppfStack_1c660 + 1);
    uVar9 = uVar9 + 0x80;
    pcVar21 = (char *)&pfStack_1c658[1].bub_ctx.space_used;
  } while (ppfVar8 != (fdb_kvs_handle **)0x8);
  ppfVar8 = apfStack_1c5b8;
  ppfVar20 = apfStack_1c2b8;
  pfVar18 = (fdb_kvs_handle *)0x0;
  do {
    uVar9 = 0;
    do {
      pfStack_1c680 = (fdb_kvs_handle *)0x1190bd;
      sprintf((char *)ppfVar8,"key%08d",uVar9);
      pfStack_1c680 = (fdb_kvs_handle *)0x1190d0;
      sprintf((char *)ppfVar20,"value%08d",uVar9);
      pcVar19 = *(char **)(&fStack_1c1b8.kvs_config.create_if_missing + (long)pfVar18 * 8);
      pfStack_1c680 = (fdb_kvs_handle *)0x1190e0;
      sVar5 = strlen((char *)ppfVar8);
      ptr_handle = (char *)(sVar5 + 1);
      pfStack_1c680 = (fdb_kvs_handle *)0x1190ec;
      sVar5 = strlen((char *)ppfVar20);
      pfStack_1c680 = (fdb_kvs_handle *)0x119101;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)pcVar19,ppfVar8,(size_t)ptr_handle,ppfVar20,sVar5 + 1);
      pcVar21 = (char *)pfVar18;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011943e;
      uVar14 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar14;
    } while (uVar14 != 10);
    pfVar18 = (fdb_kvs_handle *)&(pfVar18->kvs_config).field_0x1;
  } while (pfVar18 != (fdb_kvs_handle *)0x400);
  ptr_handle = (char *)0x0;
  do {
    if (((ulong)ptr_handle & 1) == 0) {
      pfStack_1c680 = (fdb_kvs_handle *)0x11912f;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1c5b8[(long)ptr_handle + -10],'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119470;
    }
    else {
      pfStack_1c680 = (fdb_kvs_handle *)0x119142;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1c5b8[(long)ptr_handle + -10],'\x01');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119475;
    }
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ppfVar20 = (fdb_kvs_handle **)0xffffffffffffff80;
  ptr_handle = (char *)apfStack_1a1b8;
  ppfVar8 = (fdb_kvs_handle **)(auStack_1c638 + 8);
  pfVar18 = (fdb_kvs_handle *)auStack_1c638;
  do {
    pfStack_1c680 = (fdb_kvs_handle *)0x11917c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1bdb8[(long)ppfVar20],(fdb_kvs_info *)pfVar18);
    if ((fdb_custom_cmp_variable)auStack_1c638._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1c680 = (fdb_kvs_handle *)0x1191bf;
      open_multi_files_kvs_test();
    }
    pfStack_1c680 = (fdb_kvs_handle *)0x119199;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1bdb8[(long)ppfVar20],
                              (fdb_kvs_handle **)ptr_handle,auStack_1c638._8_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119457;
    ppfVar20 = ppfVar20 + 0x10;
    ptr_handle = (char *)((long)ptr_handle + 0x400);
  } while (ppfVar20 < (fdb_kvs_handle **)0x380);
  ptr_handle = (char *)0x0;
  do {
    pfStack_1c680 = (fdb_kvs_handle *)0x1191cf;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1c5b8[(long)ptr_handle - 10],(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011945c;
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ptr_handle = (char *)&pfStack_1c668;
  pfStack_1c668 = (fdb_kvs_handle *)0x0;
  ppfVar8 = &pfStack_1c670;
  pcVar21 = "key%08d";
  ppfVar20 = apfStack_1c5b8;
  pfVar18 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1c680 = (fdb_kvs_handle *)0x119224;
    fdb_iterator_init(apfStack_1a1b8[(long)pfVar18],(fdb_iterator **)ppfVar8,(void *)0x0,0,
                      (void *)0x0,0,0);
    uVar9 = 0;
    do {
      pfStack_1c680 = (fdb_kvs_handle *)0x119233;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1c670,(fdb_doc **)ptr_handle);
      pcVar19 = (char *)pfVar18;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119443;
      pfStack_1c680 = (fdb_kvs_handle *)0x11924a;
      sprintf((char *)ppfVar20,"key%08d",uVar9);
      pfStack_1c680 = (fdb_kvs_handle *)0x11925b;
      iVar4 = strcmp((char *)ppfVar20,(char *)pfStack_1c668->op_stats);
      if (iVar4 != 0) {
        pfStack_1c680 = (fdb_kvs_handle *)0x11927d;
        open_multi_files_kvs_test();
      }
      uVar9 = (ulong)((int)uVar9 + 1);
      pfStack_1c680 = (fdb_kvs_handle *)0x11926b;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1c670);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1c680 = (fdb_kvs_handle *)0x119289;
    fdb_iterator_close((fdb_iterator *)pfStack_1c670);
    pcVar19 = (char *)&(pfVar18->config).wal_threshold;
    bVar22 = pfVar18 < (fdb_kvs_handle *)0x380;
    pfVar18 = (fdb_kvs_handle *)pcVar19;
  } while (bVar22);
  pfStack_1c680 = (fdb_kvs_handle *)0x1192aa;
  fdb_doc_free((fdb_doc *)pfStack_1c668);
  ptr_handle = "key%08d";
  ppfVar8 = apfStack_1c5b8;
  ppfVar20 = (fdb_kvs_handle **)0x0;
  do {
    uVar9 = 0;
    do {
      pfStack_1c680 = (fdb_kvs_handle *)0x1192cd;
      sprintf((char *)ppfVar8,"key%08d",uVar9);
      pcVar21 = *(char **)(&fStack_1c1b8.kvs_config.create_if_missing + (long)ppfVar20 * 8);
      pfStack_1c680 = (fdb_kvs_handle *)0x1192dd;
      sVar5 = strlen((char *)ppfVar8);
      pfStack_1c680 = (fdb_kvs_handle *)0x1192ec;
      fVar3 = fdb_del_kv((fdb_kvs_handle *)pcVar21,ppfVar8,sVar5 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119448;
      uVar14 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar14;
    } while (uVar14 != 10);
    ppfVar20 = (fdb_kvs_handle **)((long)ppfVar20 + 1);
  } while (ppfVar20 != (fdb_kvs_handle **)0x400);
  ptr_handle = "dummy_compact%d";
  ppfVar8 = apfStack_1c3b8;
  pfVar18 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1c680 = (fdb_kvs_handle *)0x119329;
    sprintf((char *)ppfVar8,"dummy_compact%d",(ulong)pfVar18 & 0xffffffff);
    pfStack_1c680 = (fdb_kvs_handle *)0x119336;
    fVar3 = fdb_compact((fdb_file_handle *)
                        apfStack_1c5b8[(long)((long)&pfVar18[-1].bub_ctx.space_used + 6)],
                        (char *)ppfVar8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119461;
    pfVar18 = (fdb_kvs_handle *)&(pfVar18->kvs_config).field_0x1;
  } while (pfVar18 != (fdb_kvs_handle *)0x8);
  ptr_handle = (char *)&pfStack_1c668;
  pfStack_1c668 = (fdb_kvs_handle *)0x0;
  ppfVar8 = &pfStack_1c670;
  pcVar21 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1c680 = (fdb_kvs_handle *)0x11937c;
    fVar3 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1c1b8.kvs_config.create_if_missing + (long)pcVar21 * 8),
                              (fdb_iterator **)ppfVar8,(void *)0x0,0,(void *)0x0,0,2);
    pfVar18 = (fdb_kvs_handle *)pcVar21;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119466;
    do {
      pfStack_1c680 = (fdb_kvs_handle *)0x119391;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1c670,(fdb_doc **)ptr_handle);
      if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0011944d;
      pfStack_1c680 = (fdb_kvs_handle *)0x1193a3;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1c670);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1c680 = (fdb_kvs_handle *)0x1193b2;
    fdb_iterator_close((fdb_iterator *)pfStack_1c670);
    pfVar18 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)pcVar21)->config).wal_threshold;
    bVar22 = pcVar21 < (fdb_kvs_handle *)0x380;
    pcVar21 = (char *)pfVar18;
  } while (bVar22);
  pfStack_1c680 = (fdb_kvs_handle *)0x1193cf;
  fdb_doc_free((fdb_doc *)pfStack_1c668);
  ptr_handle = (char *)0x0;
  while( true ) {
    pfStack_1c680 = (fdb_kvs_handle *)0x1193db;
    fVar3 = fdb_close((fdb_file_handle *)apfStack_1c5b8[(long)ptr_handle - 10]);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ptr_handle = (char *)((long)ptr_handle + 1);
    if ((fdb_kvs_handle **)ptr_handle == (fdb_kvs_handle **)0x8) {
      pfStack_1c680 = (fdb_kvs_handle *)0x1193f1;
      fdb_shutdown();
      pfStack_1c680 = (fdb_kvs_handle *)0x1193f6;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_1c680 = (fdb_kvs_handle *)0x119427;
      fprintf(_stderr,pcVar19,"open multi files kvs test");
      return;
    }
  }
LAB_0011946b:
  pfStack_1c680 = (fdb_kvs_handle *)0x119470;
  open_multi_files_kvs_test();
LAB_00119470:
  pfStack_1c680 = (fdb_kvs_handle *)0x119475;
  open_multi_files_kvs_test();
LAB_00119475:
  pfStack_1c680 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1c9f8 = (code *)0x119494;
  ppfStack_1c698 = (fdb_kvs_handle **)ptr_handle;
  ppfStack_1c690 = ppfVar20;
  ppfStack_1c688 = ppfVar8;
  pfStack_1c680 = pfVar18;
  gettimeofday(&tStack_1c9a8,(__timezone_ptr_t)0x0);
  pcStack_1c9f8 = (code *)0x119499;
  memleak_start();
  pcStack_1c9f8 = (code *)0x1194a5;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar11 = &fStack_1c998;
  pcStack_1c9f8 = (code *)0x1194b2;
  fdb_get_default_config();
  pcStack_1c9f8 = (code *)0x1194bc;
  fdb_get_default_kvs_config();
  pcStack_1c9f8 = (code *)0x1194d0;
  fVar3 = fdb_open(&pfStack_1c9d8,"./dummy1",pfVar11);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_1c9f8 = (code *)0x1194f3;
    fVar3 = fdb_kvs_open(pfStack_1c9d8,&pfStack_1c9d0,"db",&fStack_1c9c0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a6;
    pcStack_1c9f8 = (code *)0x119516;
    fVar3 = fdb_kvs_open(pfStack_1c9d8,&pfStack_1c9c8,"db2",&fStack_1c9c0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ab;
    pfVar11 = &fStack_1c7a0;
    pcStack_1c9f8 = (code *)0x119539;
    sprintf((char *)pfVar11,"key%d",0);
    ppfVar8 = apfStack_1c8a0;
    pcStack_1c9f8 = (code *)0x119554;
    sprintf((char *)ppfVar8,"body%d",0);
    pcStack_1c9f8 = (code *)0x11955c;
    pfVar18 = (fdb_kvs_handle *)strlen((char *)pfVar11);
    pcStack_1c9f8 = (code *)0x119567;
    sVar5 = strlen((char *)ppfVar8);
    ppfVar20 = &pfStack_1c9e0;
    pcStack_1c9f8 = (code *)0x119589;
    fdb_doc_create((fdb_doc **)ppfVar20,pfVar11,(size_t)pfVar18,(void *)0x0,0,ppfVar8,sVar5 + 1);
    pcStack_1c9f8 = (code *)0x119597;
    fVar3 = fdb_set(pfStack_1c9d0,(fdb_doc *)pfStack_1c9e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b0;
    pcStack_1c9f8 = (code *)0x1195ae;
    fVar3 = fdb_commit(pfStack_1c9d8,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b5;
    pcStack_1c9f8 = (code *)0x1195cf;
    sprintf((char *)(pfStack_1c9e0->field_6).seqtree,"bOdy%d",0);
    pcStack_1c9f8 = (code *)0x1195de;
    fVar3 = fdb_set(pfStack_1c9c8,(fdb_doc *)pfStack_1c9e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ba;
    pcStack_1c9f8 = (code *)0x1195f5;
    fVar3 = fdb_commit(pfStack_1c9d8,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196bf;
    pcStack_1c9f8 = (code *)0x11960c;
    fVar3 = fdb_get_metaonly(pfStack_1c9d0,(fdb_doc *)pfStack_1c9e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c4;
    pcStack_1c9f8 = (code *)0x119623;
    fVar3 = fdb_get_metaonly(pfStack_1c9c8,(fdb_doc *)pfStack_1c9e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c9;
    pcStack_1c9f8 = (code *)0x11963a;
    fVar3 = fdb_get_byoffset(pfStack_1c9d0,(fdb_doc *)pfStack_1c9e0);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1c9f8 = (code *)0x11964d;
      fdb_close(pfStack_1c9d8);
      pcStack_1c9f8 = (code *)0x119657;
      fdb_doc_free((fdb_doc *)pfStack_1c9e0);
      pcStack_1c9f8 = (code *)0x11965c;
      fdb_shutdown();
      pcStack_1c9f8 = (code *)0x119661;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pcStack_1c9f8 = (code *)0x119692;
      fprintf(_stderr,pcVar19,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1c9f8 = (code *)0x1196a6;
    get_byoffset_diff_kvs_test();
LAB_001196a6:
    pcStack_1c9f8 = (code *)0x1196ab;
    get_byoffset_diff_kvs_test();
LAB_001196ab:
    pcStack_1c9f8 = (code *)0x1196b0;
    get_byoffset_diff_kvs_test();
LAB_001196b0:
    pcStack_1c9f8 = (code *)0x1196b5;
    get_byoffset_diff_kvs_test();
LAB_001196b5:
    pcStack_1c9f8 = (code *)0x1196ba;
    get_byoffset_diff_kvs_test();
LAB_001196ba:
    pcStack_1c9f8 = (code *)0x1196bf;
    get_byoffset_diff_kvs_test();
LAB_001196bf:
    pcStack_1c9f8 = (code *)0x1196c4;
    get_byoffset_diff_kvs_test();
LAB_001196c4:
    pcStack_1c9f8 = (code *)0x1196c9;
    get_byoffset_diff_kvs_test();
LAB_001196c9:
    pcStack_1c9f8 = (code *)0x1196ce;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1c9f8 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1ca20 = pfVar11;
  ppfStack_1ca18 = ppfVar20;
  pfStack_1ca10 = (fdb_kvs_handle *)pcVar19;
  ppfStack_1ca08 = ppfVar8;
  pfStack_1ca00 = pfVar18;
  pcStack_1c9f8 = (code *)uVar9;
  gettimeofday(&tStack_1ce30,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1ce20.wal_threshold = 0x400;
  fStack_1ce20.flags = 1;
  fStack_1ce20.purging_interval = 0;
  fStack_1ce20.compaction_threshold = '\0';
  fStack_1ce20.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1ce20.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1ce88,"./dummy1",&fStack_1ce20);
  fdb_kvs_open_default(pfStack_1ce88,&pfStack_1ce90,&fStack_1ce48);
  fVar3 = fdb_set_log_callback(pfStack_1ce90,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_set_kv(pfStack_1ce90,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00119a28;
    uVar9 = 0;
    do {
      sprintf(acStack_1cc28,"key%d",uVar9);
      sprintf(acStack_1cb28,"body%d",uVar9);
      pfVar18 = pfStack_1ce90;
      sVar5 = strlen(acStack_1cc28);
      sVar6 = strlen(acStack_1cb28);
      fVar3 = fdb_set_kv(pfVar18,acStack_1cc28,sVar5,acStack_1cb28,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119a0a;
      }
      uVar14 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar14;
    } while (uVar14 != 10);
    asStack_1ce78[1] = 0x726162ffffffff;
    asStack_1ce78[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1ce60 = 0xbdbdbdbd;
    uStack_1ce5c = 0xbdbdbdbd;
    uStack_1ce58 = 0xbdbdbdbd;
    uStack_1ce54 = 0xbdbdbdbd;
    uStack_1ce50 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_rekey(pfStack_1ce88,new_key);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a2d;
    fdb_kvs_close(pfStack_1ce90);
    fdb_close(pfStack_1ce88);
    fStack_1ce20.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1ce20.encryption_key.bytes,"bar",4);
    fStack_1ce20.encryption_key.bytes[4] = 0xbd;
    fStack_1ce20.encryption_key.bytes[5] = 0xbd;
    fStack_1ce20.encryption_key.bytes[6] = 0xbd;
    fStack_1ce20.encryption_key.bytes[7] = 0xbd;
    fStack_1ce20.encryption_key.bytes[8] = 0xbd;
    fStack_1ce20.encryption_key.bytes[9] = 0xbd;
    fStack_1ce20.encryption_key.bytes[10] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0xb] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0xc] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0xd] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0xe] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0xf] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x10] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x11] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x12] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x13] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x14] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x15] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x16] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x17] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x18] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x19] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_open(&pfStack_1ce88,"./dummy1",&fStack_1ce20);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a34;
    fVar3 = fdb_kvs_open_default(pfStack_1ce88,&pfStack_1ce90,&fStack_1ce48);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_set_log_callback(pfStack_1ce90,logCallbackFunc,"api_wrapper_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a42;
      uVar9 = 0;
      while( true ) {
        sprintf(acStack_1cc28,"key%d",uVar9);
        pfVar18 = pfStack_1ce90;
        sVar5 = strlen(acStack_1cc28);
        fVar3 = fdb_get_kv(pfVar18,acStack_1cc28,sVar5,&pvStack_1ce80,asStack_1ce78);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1cd28,"body%d",uVar9);
        ptr = pvStack_1ce80;
        iVar4 = bcmp(pvStack_1ce80,acStack_1cd28,asStack_1ce78[0]);
        if (iVar4 != 0) goto LAB_00119a0a;
        fdb_free_block(ptr);
        uVar14 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar14;
        if (uVar14 == 10) {
          fdb_kvs_close(pfStack_1ce90);
          fdb_close(pfStack_1ce88);
          fdb_shutdown();
          memleak_end();
          pcVar19 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar19 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar19,"encryption rekey test");
          return;
        }
      }
LAB_00119a1a:
      rekey_test();
      goto LAB_00119a21;
    }
  }
  else {
LAB_00119a21:
    rekey_test();
LAB_00119a28:
    rekey_test();
LAB_00119a2d:
    rekey_test();
LAB_00119a34:
    rekey_test();
  }
  rekey_test();
LAB_00119a42:
  rekey_test();
  return;
}

Assistant:

void purge_logically_deleted_doc_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* fdb_test_config.json > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 2;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "purge_logically_deleted_doc_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove document #5
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, doc[5]->meta, doc[5]->metalen, NULL, 0);
    status = fdb_del(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // retrieve documents after compaction
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }
        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;

        // retrieve metadata
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get_metaonly(db, rdoc);
        if (i != 5) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            // If the above compaction takes longer than two secs (e.g., slow disk),
            // then, fdb_get_metaonly will return KEY_NOT_FOUND error.
            TEST_CHK(status == FDB_RESULT_SUCCESS ||
                     status == FDB_RESULT_KEY_NOT_FOUND);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    printf("wait for 3 seconds..\n");
    sleep(3);

    // do one more compaction
    fdb_compact(dbfile, (char *) "./dummy3");

    // retrieve documents after compaction
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }
        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;

        // retrieve metadata
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get_metaonly(db, rdoc);
        if (i != 5) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            // logically deletec document must be purged during the compaction
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("purge logically deleted doc test");
}